

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  bool bVar67;
  uint uVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  uint uVar74;
  long lVar76;
  ulong uVar77;
  bool bVar78;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar134;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  float fVar160;
  float fVar161;
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar162;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar163;
  float fVar194;
  float fVar195;
  vint4 ai_1;
  undefined1 auVar164 [16];
  float fVar196;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar197;
  float fVar216;
  float fVar217;
  vint4 ai_2;
  undefined1 auVar198 [16];
  float fVar218;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar219;
  float fVar237;
  float fVar238;
  undefined1 auVar220 [16];
  float fVar239;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar253;
  vfloat4 b0;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar247 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar252 [32];
  vint4 ai;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  vfloat4 a0_1;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  float fVar297;
  float fVar306;
  float fVar307;
  undefined1 auVar298 [16];
  float fVar308;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  float fVar309;
  float fVar317;
  float fVar318;
  undefined1 auVar310 [16];
  float fVar319;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar320;
  float fVar321;
  float fVar326;
  float fVar328;
  undefined1 auVar322 [16];
  float fVar330;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar327;
  float fVar329;
  float fVar331;
  undefined1 auVar325 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar347;
  float fVar348;
  undefined1 auVar340 [16];
  float fVar349;
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar342 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar350;
  float fVar351;
  undefined1 auVar346 [32];
  float fVar352;
  float fVar353;
  float fVar358;
  float fVar360;
  float fVar362;
  undefined1 auVar354 [16];
  float fVar359;
  float fVar361;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar363;
  float fVar364;
  float fVar371;
  float fVar373;
  vfloat4 a0;
  float fVar375;
  undefined1 auVar365 [16];
  float fVar372;
  float fVar374;
  float fVar376;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar370 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5f9;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5b8 [16];
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_408;
  Primitive *local_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar75;
  undefined1 auVar193 [32];
  undefined1 auVar369 [32];
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  lVar73 = uVar72 * 0x25;
  auVar123 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar123 = vinsertps_avx(auVar123,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar135 = *(float *)(prim + lVar73 + 0x12);
  auVar123 = vsubps_avx(auVar123,*(undefined1 (*) [16])(prim + lVar73 + 6));
  auVar105._0_4_ = fVar135 * auVar123._0_4_;
  auVar105._4_4_ = fVar135 * auVar123._4_4_;
  auVar105._8_4_ = fVar135 * auVar123._8_4_;
  auVar105._12_4_ = fVar135 * auVar123._12_4_;
  auVar256._0_4_ = fVar135 * auVar89._0_4_;
  auVar256._4_4_ = fVar135 * auVar89._4_4_;
  auVar256._8_4_ = fVar135 * auVar89._8_4_;
  auVar256._12_4_ = fVar135 * auVar89._12_4_;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xf + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar72 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1a + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1b + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1c + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar98 = vshufps_avx(auVar256,auVar256,0);
  auVar149 = vshufps_avx(auVar256,auVar256,0x55);
  auVar16 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar135 = auVar16._0_4_;
  fVar160 = auVar16._4_4_;
  fVar161 = auVar16._8_4_;
  fVar162 = auVar16._12_4_;
  fVar197 = auVar149._0_4_;
  fVar216 = auVar149._4_4_;
  fVar217 = auVar149._8_4_;
  fVar218 = auVar149._12_4_;
  fVar163 = auVar98._0_4_;
  fVar194 = auVar98._4_4_;
  fVar195 = auVar98._8_4_;
  fVar196 = auVar98._12_4_;
  auVar322._0_4_ = fVar163 * auVar123._0_4_ + fVar197 * auVar89._0_4_ + fVar135 * auVar176._0_4_;
  auVar322._4_4_ = fVar194 * auVar123._4_4_ + fVar216 * auVar89._4_4_ + fVar160 * auVar176._4_4_;
  auVar322._8_4_ = fVar195 * auVar123._8_4_ + fVar217 * auVar89._8_4_ + fVar161 * auVar176._8_4_;
  auVar322._12_4_ = fVar196 * auVar123._12_4_ + fVar218 * auVar89._12_4_ + fVar162 * auVar176._12_4_
  ;
  auVar340._0_4_ = fVar163 * auVar14._0_4_ + fVar197 * auVar15._0_4_ + auVar113._0_4_ * fVar135;
  auVar340._4_4_ = fVar194 * auVar14._4_4_ + fVar216 * auVar15._4_4_ + auVar113._4_4_ * fVar160;
  auVar340._8_4_ = fVar195 * auVar14._8_4_ + fVar217 * auVar15._8_4_ + auVar113._8_4_ * fVar161;
  auVar340._12_4_ = fVar196 * auVar14._12_4_ + fVar218 * auVar15._12_4_ + auVar113._12_4_ * fVar162;
  auVar257._0_4_ = fVar163 * auVar186._0_4_ + fVar197 * auVar122._0_4_ + auVar185._0_4_ * fVar135;
  auVar257._4_4_ = fVar194 * auVar186._4_4_ + fVar216 * auVar122._4_4_ + auVar185._4_4_ * fVar160;
  auVar257._8_4_ = fVar195 * auVar186._8_4_ + fVar217 * auVar122._8_4_ + auVar185._8_4_ * fVar161;
  auVar257._12_4_ =
       fVar196 * auVar186._12_4_ + fVar218 * auVar122._12_4_ + auVar185._12_4_ * fVar162;
  auVar98 = vshufps_avx(auVar105,auVar105,0);
  auVar149 = vshufps_avx(auVar105,auVar105,0x55);
  auVar16 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar135 = auVar16._0_4_;
  fVar160 = auVar16._4_4_;
  fVar161 = auVar16._8_4_;
  fVar162 = auVar16._12_4_;
  fVar197 = auVar149._0_4_;
  fVar216 = auVar149._4_4_;
  fVar217 = auVar149._8_4_;
  fVar218 = auVar149._12_4_;
  fVar163 = auVar98._0_4_;
  fVar194 = auVar98._4_4_;
  fVar195 = auVar98._8_4_;
  fVar196 = auVar98._12_4_;
  auVar136._0_4_ = fVar163 * auVar123._0_4_ + fVar197 * auVar89._0_4_ + fVar135 * auVar176._0_4_;
  auVar136._4_4_ = fVar194 * auVar123._4_4_ + fVar216 * auVar89._4_4_ + fVar160 * auVar176._4_4_;
  auVar136._8_4_ = fVar195 * auVar123._8_4_ + fVar217 * auVar89._8_4_ + fVar161 * auVar176._8_4_;
  auVar136._12_4_ = fVar196 * auVar123._12_4_ + fVar218 * auVar89._12_4_ + fVar162 * auVar176._12_4_
  ;
  auVar106._0_4_ = fVar163 * auVar14._0_4_ + auVar113._0_4_ * fVar135 + fVar197 * auVar15._0_4_;
  auVar106._4_4_ = fVar194 * auVar14._4_4_ + auVar113._4_4_ * fVar160 + fVar216 * auVar15._4_4_;
  auVar106._8_4_ = fVar195 * auVar14._8_4_ + auVar113._8_4_ * fVar161 + fVar217 * auVar15._8_4_;
  auVar106._12_4_ = fVar196 * auVar14._12_4_ + auVar113._12_4_ * fVar162 + fVar218 * auVar15._12_4_;
  auVar79._0_4_ = fVar163 * auVar186._0_4_ + fVar197 * auVar122._0_4_ + auVar185._0_4_ * fVar135;
  auVar79._4_4_ = fVar194 * auVar186._4_4_ + fVar216 * auVar122._4_4_ + auVar185._4_4_ * fVar160;
  auVar79._8_4_ = fVar195 * auVar186._8_4_ + fVar217 * auVar122._8_4_ + auVar185._8_4_ * fVar161;
  auVar79._12_4_ = fVar196 * auVar186._12_4_ + fVar218 * auVar122._12_4_ + auVar185._12_4_ * fVar162
  ;
  auVar240._8_4_ = 0x7fffffff;
  auVar240._0_8_ = 0x7fffffff7fffffff;
  auVar240._12_4_ = 0x7fffffff;
  auVar123 = vandps_avx(auVar322,auVar240);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar123 = vcmpps_avx(auVar123,auVar198,1);
  auVar89 = vblendvps_avx(auVar322,auVar198,auVar123);
  auVar123 = vandps_avx(auVar340,auVar240);
  auVar123 = vcmpps_avx(auVar123,auVar198,1);
  auVar176 = vblendvps_avx(auVar340,auVar198,auVar123);
  auVar123 = vandps_avx(auVar257,auVar240);
  auVar123 = vcmpps_avx(auVar123,auVar198,1);
  auVar123 = vblendvps_avx(auVar257,auVar198,auVar123);
  auVar14 = vrcpps_avx(auVar89);
  fVar163 = auVar14._0_4_;
  auVar164._0_4_ = fVar163 * auVar89._0_4_;
  fVar194 = auVar14._4_4_;
  auVar164._4_4_ = fVar194 * auVar89._4_4_;
  fVar195 = auVar14._8_4_;
  auVar164._8_4_ = fVar195 * auVar89._8_4_;
  fVar196 = auVar14._12_4_;
  auVar164._12_4_ = fVar196 * auVar89._12_4_;
  auVar258._8_4_ = 0x3f800000;
  auVar258._0_8_ = &DAT_3f8000003f800000;
  auVar258._12_4_ = 0x3f800000;
  auVar89 = vsubps_avx(auVar258,auVar164);
  fVar163 = fVar163 + fVar163 * auVar89._0_4_;
  fVar194 = fVar194 + fVar194 * auVar89._4_4_;
  fVar195 = fVar195 + fVar195 * auVar89._8_4_;
  fVar196 = fVar196 + fVar196 * auVar89._12_4_;
  auVar89 = vrcpps_avx(auVar176);
  fVar197 = auVar89._0_4_;
  auVar220._0_4_ = fVar197 * auVar176._0_4_;
  fVar216 = auVar89._4_4_;
  auVar220._4_4_ = fVar216 * auVar176._4_4_;
  fVar217 = auVar89._8_4_;
  auVar220._8_4_ = fVar217 * auVar176._8_4_;
  fVar218 = auVar89._12_4_;
  auVar220._12_4_ = fVar218 * auVar176._12_4_;
  auVar89 = vsubps_avx(auVar258,auVar220);
  fVar197 = fVar197 + fVar197 * auVar89._0_4_;
  fVar216 = fVar216 + fVar216 * auVar89._4_4_;
  fVar217 = fVar217 + fVar217 * auVar89._8_4_;
  fVar218 = fVar218 + fVar218 * auVar89._12_4_;
  auVar89 = vrcpps_avx(auVar123);
  fVar219 = auVar89._0_4_;
  auVar241._0_4_ = fVar219 * auVar123._0_4_;
  fVar237 = auVar89._4_4_;
  auVar241._4_4_ = fVar237 * auVar123._4_4_;
  fVar238 = auVar89._8_4_;
  auVar241._8_4_ = fVar238 * auVar123._8_4_;
  fVar239 = auVar89._12_4_;
  auVar241._12_4_ = fVar239 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar258,auVar241);
  fVar219 = fVar219 + fVar219 * auVar123._0_4_;
  fVar237 = fVar237 + fVar237 * auVar123._4_4_;
  fVar238 = fVar238 + fVar238 * auVar123._8_4_;
  fVar239 = fVar239 + fVar239 * auVar123._12_4_;
  auVar123 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar73 + 0x16)) *
                           *(float *)(prim + lVar73 + 0x1a)));
  auVar176 = vshufps_avx(auVar123,auVar123,0);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar123 = vpmovsxwd_avx(auVar123);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar123);
  fVar135 = auVar176._0_4_;
  fVar160 = auVar176._4_4_;
  fVar161 = auVar176._8_4_;
  fVar162 = auVar176._12_4_;
  auVar259._0_4_ = auVar89._0_4_ * fVar135 + auVar123._0_4_;
  auVar259._4_4_ = auVar89._4_4_ * fVar160 + auVar123._4_4_;
  auVar259._8_4_ = auVar89._8_4_ * fVar161 + auVar123._8_4_;
  auVar259._12_4_ = auVar89._12_4_ * fVar162 + auVar123._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar123 = vpmovsxwd_avx(auVar176);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar89 = vpmovsxwd_avx(auVar14);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar267._0_4_ = auVar89._0_4_ * fVar135 + auVar123._0_4_;
  auVar267._4_4_ = auVar89._4_4_ * fVar160 + auVar123._4_4_;
  auVar267._8_4_ = auVar89._8_4_ * fVar161 + auVar123._8_4_;
  auVar267._12_4_ = auVar89._12_4_ * fVar162 + auVar123._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar123 = vpmovsxwd_avx(auVar15);
  auVar123 = vcvtdq2ps_avx(auVar123);
  uVar77 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar72 * 2 + uVar77 + 6);
  auVar89 = vpmovsxwd_avx(auVar113);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar285._0_4_ = auVar89._0_4_ * fVar135 + auVar123._0_4_;
  auVar285._4_4_ = auVar89._4_4_ * fVar160 + auVar123._4_4_;
  auVar285._8_4_ = auVar89._8_4_ * fVar161 + auVar123._8_4_;
  auVar285._12_4_ = auVar89._12_4_ * fVar162 + auVar123._12_4_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar123 = vpmovsxwd_avx(auVar186);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar72 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar122);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar298._0_4_ = auVar89._0_4_ * fVar135 + auVar123._0_4_;
  auVar298._4_4_ = auVar89._4_4_ * fVar160 + auVar123._4_4_;
  auVar298._8_4_ = auVar89._8_4_ * fVar161 + auVar123._8_4_;
  auVar298._12_4_ = auVar89._12_4_ * fVar162 + auVar123._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar72 * 0x1d + 6);
  auVar123 = vpmovsxwd_avx(auVar185);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar72 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar89 = vpmovsxwd_avx(auVar98);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar176 = vsubps_avx(auVar89,auVar123);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar72) + 6);
  auVar89 = vpmovsxwd_avx(auVar149);
  auVar310._0_4_ = auVar176._0_4_ * fVar135 + auVar123._0_4_;
  auVar310._4_4_ = auVar176._4_4_ * fVar160 + auVar123._4_4_;
  auVar310._8_4_ = auVar176._8_4_ * fVar161 + auVar123._8_4_;
  auVar310._12_4_ = auVar176._12_4_ * fVar162 + auVar123._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar72 * 0x23 + 6);
  auVar176 = vpmovsxwd_avx(auVar16);
  auVar123 = vcvtdq2ps_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar176);
  auVar89 = vsubps_avx(auVar89,auVar123);
  auVar242._0_4_ = auVar123._0_4_ + auVar89._0_4_ * fVar135;
  auVar242._4_4_ = auVar123._4_4_ + auVar89._4_4_ * fVar160;
  auVar242._8_4_ = auVar123._8_4_ + auVar89._8_4_ * fVar161;
  auVar242._12_4_ = auVar123._12_4_ + auVar89._12_4_ * fVar162;
  auVar123 = vsubps_avx(auVar259,auVar136);
  auVar260._0_4_ = fVar163 * auVar123._0_4_;
  auVar260._4_4_ = fVar194 * auVar123._4_4_;
  auVar260._8_4_ = fVar195 * auVar123._8_4_;
  auVar260._12_4_ = fVar196 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar267,auVar136);
  auVar137._0_4_ = fVar163 * auVar123._0_4_;
  auVar137._4_4_ = fVar194 * auVar123._4_4_;
  auVar137._8_4_ = fVar195 * auVar123._8_4_;
  auVar137._12_4_ = fVar196 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar285,auVar106);
  auVar165._0_4_ = fVar197 * auVar123._0_4_;
  auVar165._4_4_ = fVar216 * auVar123._4_4_;
  auVar165._8_4_ = fVar217 * auVar123._8_4_;
  auVar165._12_4_ = fVar218 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar298,auVar106);
  auVar107._0_4_ = fVar197 * auVar123._0_4_;
  auVar107._4_4_ = fVar216 * auVar123._4_4_;
  auVar107._8_4_ = fVar217 * auVar123._8_4_;
  auVar107._12_4_ = fVar218 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar310,auVar79);
  auVar199._0_4_ = fVar219 * auVar123._0_4_;
  auVar199._4_4_ = fVar237 * auVar123._4_4_;
  auVar199._8_4_ = fVar238 * auVar123._8_4_;
  auVar199._12_4_ = fVar239 * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar242,auVar79);
  auVar80._0_4_ = fVar219 * auVar123._0_4_;
  auVar80._4_4_ = fVar237 * auVar123._4_4_;
  auVar80._8_4_ = fVar238 * auVar123._8_4_;
  auVar80._12_4_ = fVar239 * auVar123._12_4_;
  auVar123 = vpminsd_avx(auVar260,auVar137);
  auVar89 = vpminsd_avx(auVar165,auVar107);
  auVar123 = vmaxps_avx(auVar123,auVar89);
  auVar89 = vpminsd_avx(auVar199,auVar80);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar268._4_4_ = uVar4;
  auVar268._0_4_ = uVar4;
  auVar268._8_4_ = uVar4;
  auVar268._12_4_ = uVar4;
  auVar89 = vmaxps_avx(auVar89,auVar268);
  auVar123 = vmaxps_avx(auVar123,auVar89);
  local_2f8._0_4_ = auVar123._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar123._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar123._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar123._12_4_ * 0.99999964;
  auVar123 = vpmaxsd_avx(auVar260,auVar137);
  auVar89 = vpmaxsd_avx(auVar165,auVar107);
  auVar123 = vminps_avx(auVar123,auVar89);
  auVar89 = vpmaxsd_avx(auVar199,auVar80);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar138._4_4_ = uVar4;
  auVar138._0_4_ = uVar4;
  auVar138._8_4_ = uVar4;
  auVar138._12_4_ = uVar4;
  auVar89 = vminps_avx(auVar89,auVar138);
  auVar123 = vminps_avx(auVar123,auVar89);
  auVar81._0_4_ = auVar123._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar123._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar123._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar123._12_4_ * 1.0000004;
  auVar123 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar89 = vpcmpgtd_avx(auVar123,_DAT_01ff0cf0);
  auVar123 = vcmpps_avx(local_2f8,auVar81,2);
  auVar123 = vandps_avx(auVar123,auVar89);
  uVar68 = vmovmskps_avx(auVar123);
  local_5f9 = uVar68 != 0;
  if (uVar68 == 0) {
    return local_5f9;
  }
  uVar68 = uVar68 & 0xff;
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  local_408 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar370 = ZEXT464(0) << 0x20;
  local_400 = prim;
LAB_0105ef58:
  lVar73 = 0;
  if (uVar68 != 0) {
    for (; (uVar68 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  uVar71 = *(uint *)(local_400 + 2);
  uVar69 = *(uint *)(local_400 + lVar73 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar71].ptr;
  fVar135 = (pGVar7->time_range).lower;
  fVar197 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar135) / ((pGVar7->time_range).upper - fVar135));
  auVar123 = vroundss_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),9);
  auVar123 = vminss_avx(auVar123,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar176 = vmaxss_avx(ZEXT816(0) << 0x20,auVar123);
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar69 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar176._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + 0x10 + lVar76);
  pfVar1 = (float *)(*(long *)(_Var8 + lVar76) + lVar9 * uVar72);
  fVar216 = *pfVar1;
  fVar217 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar219 = pfVar1[3];
  lVar73 = uVar72 + 1;
  auVar123 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar76) + lVar9 * lVar73);
  p_Var10 = pGVar7[4].occlusionFilterN;
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar9 + 0x10 + lVar76);
  pfVar1 = (float *)(*(long *)(lVar9 + lVar76) + lVar11 * uVar72);
  fVar237 = *pfVar1;
  fVar238 = pfVar1[1];
  fVar239 = pfVar1[2];
  fVar134 = pfVar1[3];
  _Var12 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar76) + *(long *)(p_Var10 + lVar76 + 0x10) * uVar72);
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar76) + *(long *)(p_Var10 + lVar76 + 0x10) * lVar73);
  auVar261._0_4_ = *pfVar2 * 0.33333334;
  auVar261._4_4_ = pfVar2[1] * 0.33333334;
  auVar261._8_4_ = pfVar2[2] * 0.33333334;
  auVar261._12_4_ = pfVar2[3] * 0.33333334;
  lVar13 = *(long *)(_Var12 + 0x10 + lVar76);
  pfVar2 = (float *)(*(long *)(_Var12 + lVar76) + lVar13 * uVar72);
  auVar89 = *(undefined1 (*) [16])(*(long *)(lVar9 + lVar76) + lVar11 * lVar73);
  fVar197 = fVar197 - auVar176._0_4_;
  fVar309 = fVar216 + *pfVar1 * 0.33333334;
  fVar317 = fVar217 + pfVar1[1] * 0.33333334;
  fVar318 = fVar218 + pfVar1[2] * 0.33333334;
  fVar319 = fVar219 + pfVar1[3] * 0.33333334;
  auVar176 = vsubps_avx(auVar123,auVar261);
  fVar297 = *pfVar2 * 0.33333334 + fVar237;
  fVar306 = pfVar2[1] * 0.33333334 + fVar238;
  fVar307 = pfVar2[2] * 0.33333334 + fVar239;
  fVar308 = pfVar2[3] * 0.33333334 + fVar134;
  pfVar1 = (float *)(*(long *)(_Var12 + lVar76) + lVar13 * lVar73);
  auVar82._0_4_ = *pfVar1 * 0.33333334;
  auVar82._4_4_ = pfVar1[1] * 0.33333334;
  auVar82._8_4_ = pfVar1[2] * 0.33333334;
  auVar82._12_4_ = pfVar1[3] * 0.33333334;
  auVar14 = vsubps_avx(auVar89,auVar82);
  fVar135 = auVar123._0_4_;
  fVar161 = auVar123._4_4_;
  fVar163 = auVar123._8_4_;
  fVar373 = auVar370._8_4_;
  fVar195 = auVar123._12_4_;
  fVar375 = auVar370._12_4_;
  fVar320 = auVar176._0_4_ * 0.0;
  fVar326 = auVar176._4_4_ * 0.0;
  fVar328 = fVar373 * auVar176._8_4_;
  fVar330 = fVar375 * auVar176._12_4_;
  fVar352 = fVar320 + fVar135 * 0.0;
  fVar358 = fVar326 + fVar161 * 0.0;
  fVar360 = fVar328 + fVar373 * fVar163;
  fVar362 = fVar330 + fVar375 * fVar195;
  auVar83._0_4_ = fVar352 + fVar309 * 3.0;
  auVar83._4_4_ = fVar358 + fVar317 * 3.0;
  auVar83._8_4_ = fVar360 + fVar318 * 3.0;
  auVar83._12_4_ = fVar362 + fVar319 * 3.0;
  auVar108._0_4_ = fVar216 * 3.0;
  auVar108._4_4_ = fVar217 * 3.0;
  auVar108._8_4_ = fVar218 * 3.0;
  auVar108._12_4_ = fVar219 * 3.0;
  auVar185 = vsubps_avx(auVar83,auVar108);
  fVar160 = auVar89._0_4_;
  fVar162 = auVar89._4_4_;
  fVar194 = auVar89._8_4_;
  fVar196 = auVar89._12_4_;
  fVar339 = auVar14._0_4_ * 0.0;
  fVar347 = auVar14._4_4_ * 0.0;
  fVar348 = fVar373 * auVar14._8_4_;
  fVar349 = fVar375 * auVar14._12_4_;
  fVar363 = fVar339 + fVar160 * 0.0;
  fVar371 = fVar347 + fVar162 * 0.0;
  fVar373 = fVar348 + fVar373 * fVar194;
  fVar375 = fVar349 + fVar375 * fVar196;
  auVar84._0_4_ = fVar363 + fVar297 * 3.0;
  auVar84._4_4_ = fVar371 + fVar306 * 3.0;
  auVar84._8_4_ = fVar373 + fVar307 * 3.0;
  auVar84._12_4_ = fVar375 + fVar308 * 3.0;
  auVar269._0_4_ = fVar237 * 3.0;
  auVar269._4_4_ = fVar238 * 3.0;
  auVar269._8_4_ = fVar239 * 3.0;
  auVar269._12_4_ = fVar134 * 3.0;
  auVar15 = vsubps_avx(auVar84,auVar269);
  lVar11 = *(long *)(_Var8 + 0x38 + lVar76);
  lVar13 = *(long *)(_Var8 + 0x48 + lVar76);
  puVar3 = (undefined8 *)(lVar11 + lVar13 * uVar72);
  uVar5 = *puVar3;
  uVar56 = puVar3[1];
  fVar309 = fVar309 * 0.0;
  fVar317 = fVar317 * 0.0;
  fVar318 = fVar318 * 0.0;
  fVar319 = fVar319 * 0.0;
  auVar311._0_4_ = fVar352 + fVar309 + fVar216;
  auVar311._4_4_ = fVar358 + fVar317 + fVar217;
  auVar311._8_4_ = fVar360 + fVar318 + fVar218;
  auVar311._12_4_ = fVar362 + fVar319 + fVar219;
  fVar297 = fVar297 * 0.0;
  fVar306 = fVar306 * 0.0;
  fVar307 = fVar307 * 0.0;
  fVar308 = fVar308 * 0.0;
  auVar365._0_4_ = fVar297 + fVar363 + fVar237;
  auVar365._4_4_ = fVar306 + fVar371 + fVar238;
  auVar365._8_4_ = fVar307 + fVar373 + fVar239;
  auVar365._12_4_ = fVar308 + fVar375 + fVar134;
  auVar139._0_4_ = fVar216 * 0.0;
  auVar139._4_4_ = fVar217 * 0.0;
  auVar139._8_4_ = fVar218 * 0.0;
  auVar139._12_4_ = fVar219 * 0.0;
  auVar299._0_4_ = fVar320 + fVar135 + fVar309 + auVar139._0_4_;
  auVar299._4_4_ = fVar326 + fVar161 + fVar317 + auVar139._4_4_;
  auVar299._8_4_ = fVar328 + fVar163 + fVar318 + auVar139._8_4_;
  auVar299._12_4_ = fVar330 + fVar195 + fVar319 + auVar139._12_4_;
  auVar166._0_4_ = fVar135 * 3.0;
  auVar166._4_4_ = fVar161 * 3.0;
  auVar166._8_4_ = fVar163 * 3.0;
  auVar166._12_4_ = fVar195 * 3.0;
  auVar262._0_4_ = auVar176._0_4_ * 3.0;
  auVar262._4_4_ = auVar176._4_4_ * 3.0;
  auVar262._8_4_ = auVar176._8_4_ * 3.0;
  auVar262._12_4_ = auVar176._12_4_ * 3.0;
  auVar123 = vsubps_avx(auVar166,auVar262);
  auVar85._0_4_ = fVar309 + auVar123._0_4_;
  auVar85._4_4_ = fVar317 + auVar123._4_4_;
  auVar85._8_4_ = fVar318 + auVar123._8_4_;
  auVar85._12_4_ = fVar319 + auVar123._12_4_;
  auVar98 = vsubps_avx(auVar85,auVar139);
  auVar140._0_4_ = fVar237 * 0.0;
  auVar140._4_4_ = fVar238 * 0.0;
  auVar140._8_4_ = fVar239 * 0.0;
  auVar140._12_4_ = fVar134 * 0.0;
  auVar86._0_4_ = auVar140._0_4_ + fVar297 + fVar339 + fVar160;
  auVar86._4_4_ = auVar140._4_4_ + fVar306 + fVar347 + fVar162;
  auVar86._8_4_ = auVar140._8_4_ + fVar307 + fVar348 + fVar194;
  auVar86._12_4_ = auVar140._12_4_ + fVar308 + fVar349 + fVar196;
  auVar167._0_4_ = fVar160 * 3.0;
  auVar167._4_4_ = fVar162 * 3.0;
  auVar167._8_4_ = fVar194 * 3.0;
  auVar167._12_4_ = fVar196 * 3.0;
  auVar200._0_4_ = auVar14._0_4_ * 3.0;
  auVar200._4_4_ = auVar14._4_4_ * 3.0;
  auVar200._8_4_ = auVar14._8_4_ * 3.0;
  auVar200._12_4_ = auVar14._12_4_ * 3.0;
  auVar123 = vsubps_avx(auVar167,auVar200);
  auVar168._0_4_ = fVar297 + auVar123._0_4_;
  auVar168._4_4_ = fVar306 + auVar123._4_4_;
  auVar168._8_4_ = fVar307 + auVar123._8_4_;
  auVar168._12_4_ = fVar308 + auVar123._12_4_;
  auVar113 = vsubps_avx(auVar168,auVar140);
  auVar123 = vshufps_avx(auVar185,auVar185,0xc9);
  auVar89 = vshufps_avx(auVar365,auVar365,0xc9);
  fVar216 = auVar185._0_4_;
  auVar201._0_4_ = fVar216 * auVar89._0_4_;
  fVar218 = auVar185._4_4_;
  auVar201._4_4_ = fVar218 * auVar89._4_4_;
  fVar238 = auVar185._8_4_;
  auVar201._8_4_ = fVar238 * auVar89._8_4_;
  fVar239 = auVar185._12_4_;
  auVar201._12_4_ = fVar239 * auVar89._12_4_;
  auVar221._0_4_ = auVar365._0_4_ * auVar123._0_4_;
  auVar221._4_4_ = auVar365._4_4_ * auVar123._4_4_;
  auVar221._8_4_ = auVar365._8_4_ * auVar123._8_4_;
  auVar221._12_4_ = auVar365._12_4_ * auVar123._12_4_;
  auVar89 = vsubps_avx(auVar221,auVar201);
  auVar176 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar89 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar222._0_4_ = fVar216 * auVar89._0_4_;
  auVar222._4_4_ = fVar218 * auVar89._4_4_;
  auVar222._8_4_ = fVar238 * auVar89._8_4_;
  auVar222._12_4_ = fVar239 * auVar89._12_4_;
  auVar141._0_4_ = auVar15._0_4_ * auVar123._0_4_;
  auVar141._4_4_ = auVar15._4_4_ * auVar123._4_4_;
  auVar141._8_4_ = auVar15._8_4_ * auVar123._8_4_;
  auVar141._12_4_ = auVar15._12_4_ * auVar123._12_4_;
  auVar123 = vsubps_avx(auVar141,auVar222);
  auVar14 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar123 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
  fVar352 = auVar98._0_4_;
  auVar142._0_4_ = fVar352 * auVar89._0_4_;
  fVar358 = auVar98._4_4_;
  auVar142._4_4_ = fVar358 * auVar89._4_4_;
  fVar360 = auVar98._8_4_;
  auVar142._8_4_ = fVar360 * auVar89._8_4_;
  fVar362 = auVar98._12_4_;
  auVar142._12_4_ = fVar362 * auVar89._12_4_;
  auVar87._0_4_ = auVar123._0_4_ * auVar86._0_4_;
  auVar87._4_4_ = auVar123._4_4_ * auVar86._4_4_;
  auVar87._8_4_ = auVar123._8_4_ * auVar86._8_4_;
  auVar87._12_4_ = auVar123._12_4_ * auVar86._12_4_;
  auVar89 = vsubps_avx(auVar87,auVar142);
  auVar15 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar89 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar88._0_4_ = fVar352 * auVar89._0_4_;
  auVar88._4_4_ = fVar358 * auVar89._4_4_;
  auVar88._8_4_ = fVar360 * auVar89._8_4_;
  auVar88._12_4_ = fVar362 * auVar89._12_4_;
  auVar169._0_4_ = auVar123._0_4_ * auVar113._0_4_;
  auVar169._4_4_ = auVar123._4_4_ * auVar113._4_4_;
  auVar169._8_4_ = auVar123._8_4_ * auVar113._8_4_;
  auVar169._12_4_ = auVar123._12_4_ * auVar113._12_4_;
  auVar123 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar89 = vsubps_avx(auVar169,auVar88);
  auVar113 = vshufps_avx(auVar89,auVar89,0xc9);
  fVar160 = auVar123._0_4_;
  auVar122 = ZEXT416((uint)fVar160);
  auVar89 = vrsqrtss_avx(auVar122,auVar122);
  fVar135 = auVar89._0_4_;
  auVar89 = ZEXT416((uint)(fVar135 * 1.5 - fVar160 * 0.5 * fVar135 * fVar135 * fVar135));
  auVar186 = vshufps_avx(auVar89,auVar89,0);
  fVar163 = auVar186._0_4_ * auVar176._0_4_;
  fVar194 = auVar186._4_4_ * auVar176._4_4_;
  fVar195 = auVar186._8_4_ * auVar176._8_4_;
  fVar196 = auVar186._12_4_ * auVar176._12_4_;
  auVar89 = vdpps_avx(auVar176,auVar14,0x7f);
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar223._0_4_ = auVar123._0_4_ * auVar14._0_4_;
  auVar223._4_4_ = auVar123._4_4_ * auVar14._4_4_;
  auVar223._8_4_ = auVar123._8_4_ * auVar14._8_4_;
  auVar223._12_4_ = auVar123._12_4_ * auVar14._12_4_;
  auVar123 = vshufps_avx(auVar89,auVar89,0);
  auVar202._0_4_ = auVar123._0_4_ * auVar176._0_4_;
  auVar202._4_4_ = auVar123._4_4_ * auVar176._4_4_;
  auVar202._8_4_ = auVar123._8_4_ * auVar176._8_4_;
  auVar202._12_4_ = auVar123._12_4_ * auVar176._12_4_;
  auVar149 = vsubps_avx(auVar223,auVar202);
  auVar123 = vrcpss_avx(auVar122,auVar122);
  auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar160 * auVar123._0_4_)));
  auVar122 = vshufps_avx(auVar123,auVar123,0);
  auVar176 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar89 = vblendps_avx(auVar176,_DAT_01feba10,0xe);
  auVar123 = vrsqrtss_avx(auVar89,auVar89);
  fVar135 = auVar123._0_4_;
  auVar14 = vdpps_avx(auVar15,auVar113,0x7f);
  auVar123 = vshufps_avx(auVar176,auVar176,0);
  auVar243._0_4_ = auVar123._0_4_ * auVar113._0_4_;
  auVar243._4_4_ = auVar123._4_4_ * auVar113._4_4_;
  auVar243._8_4_ = auVar123._8_4_ * auVar113._8_4_;
  auVar243._12_4_ = auVar123._12_4_ * auVar113._12_4_;
  auVar123 = *(undefined1 (*) [16])(lVar11 + lVar13 * lVar73);
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar76 + 0x38) +
                    *(long *)(p_Var10 + lVar76 + 0x48) * uVar72);
  auVar113 = ZEXT416((uint)(fVar135 * 1.5 - auVar176._0_4_ * 0.5 * fVar135 * fVar135 * fVar135));
  auVar113 = vshufps_avx(auVar113,auVar113,0);
  auVar14 = vshufps_avx(auVar14,auVar14,0);
  auVar270._0_4_ = auVar14._0_4_ * auVar15._0_4_;
  auVar270._4_4_ = auVar14._4_4_ * auVar15._4_4_;
  auVar270._8_4_ = auVar14._8_4_ * auVar15._8_4_;
  auVar270._12_4_ = auVar14._12_4_ * auVar15._12_4_;
  fVar135 = auVar15._0_4_ * auVar113._0_4_;
  fVar160 = auVar15._4_4_ * auVar113._4_4_;
  fVar161 = auVar15._8_4_ * auVar113._8_4_;
  fVar162 = auVar15._12_4_ * auVar113._12_4_;
  auVar15 = vsubps_avx(auVar243,auVar270);
  auVar89 = vrcpss_avx(auVar89,auVar89);
  auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - auVar176._0_4_ * auVar89._0_4_)));
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar176 = vshufps_avx(auVar311,auVar311,0xff);
  auVar263._0_4_ = auVar176._0_4_ * fVar163;
  auVar263._4_4_ = auVar176._4_4_ * fVar194;
  auVar263._8_4_ = auVar176._8_4_ * fVar195;
  auVar263._12_4_ = auVar176._12_4_ * fVar196;
  auVar16 = vsubps_avx(auVar311,auVar263);
  auVar14 = vshufps_avx(auVar185,auVar185,0xff);
  auVar170._0_4_ =
       auVar14._0_4_ * fVar163 + auVar176._0_4_ * auVar186._0_4_ * auVar122._0_4_ * auVar149._0_4_;
  auVar170._4_4_ =
       auVar14._4_4_ * fVar194 + auVar176._4_4_ * auVar186._4_4_ * auVar122._4_4_ * auVar149._4_4_;
  auVar170._8_4_ =
       auVar14._8_4_ * fVar195 + auVar176._8_4_ * auVar186._8_4_ * auVar122._8_4_ * auVar149._8_4_;
  auVar170._12_4_ =
       auVar14._12_4_ * fVar196 +
       auVar176._12_4_ * auVar186._12_4_ * auVar122._12_4_ * auVar149._12_4_;
  auVar186 = vsubps_avx(auVar185,auVar170);
  auVar176 = vshufps_avx(auVar299,auVar299,0xff);
  auVar224._0_4_ = auVar176._0_4_ * fVar135;
  auVar224._4_4_ = auVar176._4_4_ * fVar160;
  auVar224._8_4_ = auVar176._8_4_ * fVar161;
  auVar224._12_4_ = auVar176._12_4_ * fVar162;
  auVar122 = vsubps_avx(auVar299,auVar224);
  auVar14 = vshufps_avx(auVar98,auVar98,0xff);
  auVar90._0_4_ =
       auVar14._0_4_ * fVar135 + auVar176._0_4_ * auVar113._0_4_ * auVar15._0_4_ * auVar89._0_4_;
  auVar90._4_4_ =
       auVar14._4_4_ * fVar160 + auVar176._4_4_ * auVar113._4_4_ * auVar15._4_4_ * auVar89._4_4_;
  auVar90._8_4_ =
       auVar14._8_4_ * fVar161 + auVar176._8_4_ * auVar113._8_4_ * auVar15._8_4_ * auVar89._8_4_;
  auVar90._12_4_ =
       auVar14._12_4_ * fVar162 +
       auVar176._12_4_ * auVar113._12_4_ * auVar15._12_4_ * auVar89._12_4_;
  auVar185 = vsubps_avx(auVar98,auVar90);
  local_518._4_4_ = auVar299._4_4_ + auVar224._4_4_;
  local_518._0_4_ = auVar299._0_4_ + auVar224._0_4_;
  fStack_510 = auVar299._8_4_ + auVar224._8_4_;
  fStack_50c = auVar299._12_4_ + auVar224._12_4_;
  local_5f8._0_4_ = (undefined4)uVar5;
  local_5f8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  fStack_5f0 = (float)uVar56;
  fStack_5ec = (float)((ulong)uVar56 >> 0x20);
  fVar339 = (float)local_5f8._0_4_ + *pfVar1 * 0.33333334;
  fVar347 = (float)local_5f8._4_4_ + pfVar1[1] * 0.33333334;
  fVar348 = fStack_5f0 + pfVar1[2] * 0.33333334;
  fVar349 = fStack_5ec + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar76 + 0x38) +
                    *(long *)(p_Var10 + lVar76 + 0x48) * lVar73);
  auVar91._0_4_ = *pfVar1 * 0.33333334;
  auVar91._4_4_ = pfVar1[1] * 0.33333334;
  auVar91._8_4_ = pfVar1[2] * 0.33333334;
  auVar91._12_4_ = pfVar1[3] * 0.33333334;
  auVar89 = vsubps_avx(auVar123,auVar91);
  fVar363 = auVar123._0_4_;
  fVar371 = auVar123._4_4_;
  fVar373 = auVar123._8_4_;
  fVar375 = auVar123._12_4_;
  fVar320 = auVar89._0_4_ * 0.0;
  fVar326 = auVar89._4_4_ * 0.0;
  fVar328 = auVar89._8_4_ * 0.0;
  fVar330 = auVar89._12_4_ * 0.0;
  fVar364 = fVar363 * 0.0 + fVar320;
  fVar372 = fVar371 * 0.0 + fVar326;
  fVar374 = fVar373 * 0.0 + fVar328;
  fVar376 = fVar375 * 0.0 + fVar330;
  auVar109._0_4_ = fVar364 + fVar339 * 3.0;
  auVar109._4_4_ = fVar372 + fVar347 * 3.0;
  auVar109._8_4_ = fVar374 + fVar348 * 3.0;
  auVar109._12_4_ = fVar376 + fVar349 * 3.0;
  auVar143._0_4_ = (float)local_5f8._0_4_ * 3.0;
  auVar143._4_4_ = (float)local_5f8._4_4_ * 3.0;
  auVar143._8_4_ = fStack_5f0 * 3.0;
  auVar143._12_4_ = fStack_5ec * 3.0;
  auVar98 = vsubps_avx(auVar109,auVar143);
  lVar11 = *(long *)(lVar9 + 0x38 + lVar76);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar76);
  lVar13 = *(long *)(_Var12 + 0x38 + lVar76);
  lVar76 = *(long *)(_Var12 + 0x48 + lVar76);
  pfVar1 = (float *)(lVar11 + lVar9 * uVar72);
  fVar135 = *pfVar1;
  fVar160 = pfVar1[1];
  fVar161 = pfVar1[2];
  fVar162 = pfVar1[3];
  pfVar1 = (float *)(lVar13 + uVar72 * lVar76);
  fVar297 = fVar135 + *pfVar1 * 0.33333334;
  fVar306 = fVar160 + pfVar1[1] * 0.33333334;
  fVar307 = fVar161 + pfVar1[2] * 0.33333334;
  fVar308 = fVar162 + pfVar1[3] * 0.33333334;
  auVar123 = *(undefined1 (*) [16])(lVar11 + lVar9 * lVar73);
  pfVar1 = (float *)(lVar13 + lVar76 * lVar73);
  auVar144._0_4_ = *pfVar1 * 0.33333334;
  auVar144._4_4_ = pfVar1[1] * 0.33333334;
  auVar144._8_4_ = pfVar1[2] * 0.33333334;
  auVar144._12_4_ = pfVar1[3] * 0.33333334;
  auVar176 = vsubps_avx(auVar123,auVar144);
  fVar163 = auVar123._0_4_;
  fVar194 = auVar123._4_4_;
  fVar195 = auVar123._8_4_;
  fVar196 = auVar123._12_4_;
  fVar217 = auVar176._0_4_ * 0.0;
  fVar219 = auVar176._4_4_ * 0.0;
  fVar237 = auVar176._8_4_ * 0.0;
  fVar134 = auVar176._12_4_ * 0.0;
  fVar309 = fVar163 * 0.0 + fVar217;
  fVar317 = fVar194 * 0.0 + fVar219;
  fVar318 = fVar195 * 0.0 + fVar237;
  fVar319 = fVar196 * 0.0 + fVar134;
  auVar244._0_4_ = fVar297 * 3.0 + fVar309;
  auVar244._4_4_ = fVar306 * 3.0 + fVar317;
  auVar244._8_4_ = fVar307 * 3.0 + fVar318;
  auVar244._12_4_ = fVar308 * 3.0 + fVar319;
  auVar271._0_4_ = fVar135 * 3.0;
  auVar271._4_4_ = fVar160 * 3.0;
  auVar271._8_4_ = fVar161 * 3.0;
  auVar271._12_4_ = fVar162 * 3.0;
  auVar14 = vsubps_avx(auVar244,auVar271);
  auVar272._0_4_ = fVar363 * 3.0;
  auVar272._4_4_ = fVar371 * 3.0;
  auVar272._8_4_ = fVar373 * 3.0;
  auVar272._12_4_ = fVar375 * 3.0;
  auVar323._0_4_ = auVar89._0_4_ * 3.0;
  auVar323._4_4_ = auVar89._4_4_ * 3.0;
  auVar323._8_4_ = auVar89._8_4_ * 3.0;
  auVar323._12_4_ = auVar89._12_4_ * 3.0;
  auVar123 = vsubps_avx(auVar272,auVar323);
  fVar339 = fVar339 * 0.0;
  fVar347 = fVar347 * 0.0;
  fVar348 = fVar348 * 0.0;
  fVar349 = fVar349 * 0.0;
  auVar273._0_4_ = fVar339 + auVar123._0_4_;
  auVar273._4_4_ = fVar347 + auVar123._4_4_;
  auVar273._8_4_ = fVar348 + auVar123._8_4_;
  auVar273._12_4_ = fVar349 + auVar123._12_4_;
  auVar324._0_4_ = (float)local_5f8._0_4_ + fVar339 + fVar364;
  auVar324._4_4_ = (float)local_5f8._4_4_ + fVar347 + fVar372;
  auVar324._8_4_ = fStack_5f0 + fVar348 + fVar374;
  auVar324._12_4_ = fStack_5ec + fVar349 + fVar376;
  auVar286._0_4_ = (float)local_5f8._0_4_ * 0.0;
  auVar286._4_4_ = (float)local_5f8._4_4_ * 0.0;
  auVar286._8_4_ = fStack_5f0 * 0.0;
  auVar286._12_4_ = fStack_5ec * 0.0;
  local_5f8._0_4_ = auVar286._0_4_ + fVar339 + fVar363 + fVar320;
  local_5f8._4_4_ = auVar286._4_4_ + fVar347 + fVar371 + fVar326;
  fStack_5f0 = auVar286._8_4_ + fVar348 + fVar373 + fVar328;
  fStack_5ec = auVar286._12_4_ + fVar349 + fVar375 + fVar330;
  auVar149 = vsubps_avx(auVar273,auVar286);
  auVar92._0_4_ = fVar163 * 3.0;
  auVar92._4_4_ = fVar194 * 3.0;
  auVar92._8_4_ = fVar195 * 3.0;
  auVar92._12_4_ = fVar196 * 3.0;
  auVar171._0_4_ = auVar176._0_4_ * 3.0;
  auVar171._4_4_ = auVar176._4_4_ * 3.0;
  auVar171._8_4_ = auVar176._8_4_ * 3.0;
  auVar171._12_4_ = auVar176._12_4_ * 3.0;
  auVar123 = vsubps_avx(auVar92,auVar171);
  fVar297 = fVar297 * 0.0;
  fVar306 = fVar306 * 0.0;
  fVar307 = fVar307 * 0.0;
  fVar308 = fVar308 * 0.0;
  auVar93._0_4_ = fVar297 + auVar123._0_4_;
  auVar93._4_4_ = fVar306 + auVar123._4_4_;
  auVar93._8_4_ = fVar307 + auVar123._8_4_;
  auVar93._12_4_ = fVar308 + auVar123._12_4_;
  auVar145._0_4_ = fVar135 + fVar297 + fVar309;
  auVar145._4_4_ = fVar160 + fVar306 + fVar317;
  auVar145._8_4_ = fVar161 + fVar307 + fVar318;
  auVar145._12_4_ = fVar162 + fVar308 + fVar319;
  auVar172._0_4_ = fVar135 * 0.0;
  auVar172._4_4_ = fVar160 * 0.0;
  auVar172._8_4_ = fVar161 * 0.0;
  auVar172._12_4_ = fVar162 * 0.0;
  auVar110._0_4_ = auVar172._0_4_ + fVar297 + fVar163 + fVar217;
  auVar110._4_4_ = auVar172._4_4_ + fVar306 + fVar194 + fVar219;
  auVar110._8_4_ = auVar172._8_4_ + fVar307 + fVar195 + fVar237;
  auVar110._12_4_ = auVar172._12_4_ + fVar308 + fVar196 + fVar134;
  auVar89 = vsubps_avx(auVar93,auVar172);
  auVar123 = vshufps_avx(auVar145,auVar145,0xc9);
  fVar318 = auVar98._0_4_;
  auVar173._0_4_ = fVar318 * auVar123._0_4_;
  fVar297 = auVar98._4_4_;
  auVar173._4_4_ = fVar297 * auVar123._4_4_;
  fVar306 = auVar98._8_4_;
  auVar173._8_4_ = fVar306 * auVar123._8_4_;
  fVar307 = auVar98._12_4_;
  auVar173._12_4_ = fVar307 * auVar123._12_4_;
  auVar123 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar146._0_4_ = auVar123._0_4_ * auVar145._0_4_;
  auVar146._4_4_ = auVar123._4_4_ * auVar145._4_4_;
  auVar146._8_4_ = auVar123._8_4_ * auVar145._8_4_;
  auVar146._12_4_ = auVar123._12_4_ * auVar145._12_4_;
  auVar176 = vsubps_avx(auVar146,auVar173);
  auVar174._0_4_ = auVar123._0_4_ * auVar14._0_4_;
  auVar174._4_4_ = auVar123._4_4_ * auVar14._4_4_;
  auVar174._8_4_ = auVar123._8_4_ * auVar14._8_4_;
  auVar174._12_4_ = auVar123._12_4_ * auVar14._12_4_;
  auVar123 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar203._0_4_ = fVar318 * auVar123._0_4_;
  auVar203._4_4_ = fVar297 * auVar123._4_4_;
  auVar203._8_4_ = fVar306 * auVar123._8_4_;
  auVar203._12_4_ = fVar307 * auVar123._12_4_;
  auVar14 = vsubps_avx(auVar174,auVar203);
  auVar123 = vshufps_avx(auVar110,auVar110,0xc9);
  fVar217 = auVar149._0_4_;
  auVar204._0_4_ = fVar217 * auVar123._0_4_;
  fVar237 = auVar149._4_4_;
  auVar204._4_4_ = fVar237 * auVar123._4_4_;
  fVar309 = auVar149._8_4_;
  auVar204._8_4_ = fVar309 * auVar123._8_4_;
  fVar317 = auVar149._12_4_;
  auVar204._12_4_ = fVar317 * auVar123._12_4_;
  auVar123 = vshufps_avx(auVar149,auVar149,0xc9);
  auVar111._0_4_ = auVar123._0_4_ * auVar110._0_4_;
  auVar111._4_4_ = auVar123._4_4_ * auVar110._4_4_;
  auVar111._8_4_ = auVar123._8_4_ * auVar110._8_4_;
  auVar111._12_4_ = auVar123._12_4_ * auVar110._12_4_;
  auVar15 = vsubps_avx(auVar111,auVar204);
  auVar176 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar112._0_4_ = auVar123._0_4_ * auVar89._0_4_;
  auVar112._4_4_ = auVar123._4_4_ * auVar89._4_4_;
  auVar112._8_4_ = auVar123._8_4_ * auVar89._8_4_;
  auVar112._12_4_ = auVar123._12_4_ * auVar89._12_4_;
  auVar123 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar94._0_4_ = fVar217 * auVar123._0_4_;
  auVar94._4_4_ = fVar237 * auVar123._4_4_;
  auVar94._8_4_ = fVar309 * auVar123._8_4_;
  auVar94._12_4_ = fVar317 * auVar123._12_4_;
  auVar123 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar79 = vsubps_avx(auVar112,auVar94);
  fVar135 = auVar123._0_4_;
  auVar113 = ZEXT416((uint)fVar135);
  auVar89 = vrsqrtss_avx(auVar113,auVar113);
  fVar160 = auVar89._0_4_;
  auVar89 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar225._0_4_ = auVar123._0_4_ * auVar89._0_4_;
  auVar225._4_4_ = auVar123._4_4_ * auVar89._4_4_;
  auVar225._8_4_ = auVar123._8_4_ * auVar89._8_4_;
  auVar225._12_4_ = auVar123._12_4_ * auVar89._12_4_;
  auVar123 = vdpps_avx(auVar176,auVar89,0x7f);
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar175._0_4_ = auVar176._0_4_ * auVar123._0_4_;
  auVar175._4_4_ = auVar176._4_4_ * auVar123._4_4_;
  auVar175._8_4_ = auVar176._8_4_ * auVar123._8_4_;
  auVar175._12_4_ = auVar176._12_4_ * auVar123._12_4_;
  auVar80 = vsubps_avx(auVar225,auVar175);
  auVar123 = vrcpss_avx(auVar113,auVar113);
  auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar135 * auVar123._0_4_)));
  auVar14 = vshufps_avx(auVar123,auVar123,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar123 = ZEXT416((uint)(fVar160 * 1.5 - fVar135 * 0.5 * fVar160 * fVar160 * fVar160));
  auVar113 = vshufps_avx(auVar123,auVar123,0);
  fVar163 = auVar176._0_4_ * auVar113._0_4_;
  fVar194 = auVar176._4_4_ * auVar113._4_4_;
  fVar195 = auVar176._8_4_ * auVar113._8_4_;
  fVar196 = auVar176._12_4_ * auVar113._12_4_;
  auVar123 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar135 = auVar123._0_4_;
  auVar176 = ZEXT416((uint)fVar135);
  auVar89 = vrsqrtss_avx(auVar176,auVar176);
  fVar160 = auVar89._0_4_;
  auVar89 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar245._0_4_ = auVar123._0_4_ * auVar89._0_4_;
  auVar245._4_4_ = auVar123._4_4_ * auVar89._4_4_;
  auVar245._8_4_ = auVar123._8_4_ * auVar89._8_4_;
  auVar245._12_4_ = auVar123._12_4_ * auVar89._12_4_;
  auVar123 = vdpps_avx(auVar15,auVar89,0x7f);
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar95._0_4_ = auVar123._0_4_ * auVar15._0_4_;
  auVar95._4_4_ = auVar123._4_4_ * auVar15._4_4_;
  auVar95._8_4_ = auVar123._8_4_ * auVar15._8_4_;
  auVar95._12_4_ = auVar123._12_4_ * auVar15._12_4_;
  auVar79 = vsubps_avx(auVar245,auVar95);
  auVar123 = vrcpss_avx(auVar176,auVar176);
  auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar135 * auVar123._0_4_)));
  auVar123 = vshufps_avx(auVar123,auVar123,0);
  auVar89 = ZEXT416((uint)(fVar160 * 1.5 - fVar160 * fVar160 * fVar135 * 0.5 * fVar160));
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  fVar135 = auVar15._0_4_ * auVar89._0_4_;
  fVar160 = auVar15._4_4_ * auVar89._4_4_;
  fVar161 = auVar15._8_4_ * auVar89._8_4_;
  fVar162 = auVar15._12_4_ * auVar89._12_4_;
  auVar176 = vshufps_avx(auVar98,auVar98,0xff);
  auVar15 = vshufps_avx(auVar324,auVar324,0xff);
  auVar226._0_4_ = fVar163 * auVar15._0_4_;
  auVar226._4_4_ = fVar194 * auVar15._4_4_;
  auVar226._8_4_ = fVar195 * auVar15._8_4_;
  auVar226._12_4_ = fVar196 * auVar15._12_4_;
  auVar114._0_4_ =
       fVar163 * auVar176._0_4_ + auVar15._0_4_ * auVar113._0_4_ * auVar14._0_4_ * auVar80._0_4_;
  auVar114._4_4_ =
       fVar194 * auVar176._4_4_ + auVar15._4_4_ * auVar113._4_4_ * auVar14._4_4_ * auVar80._4_4_;
  auVar114._8_4_ =
       fVar195 * auVar176._8_4_ + auVar15._8_4_ * auVar113._8_4_ * auVar14._8_4_ * auVar80._8_4_;
  auVar114._12_4_ =
       fVar196 * auVar176._12_4_ +
       auVar15._12_4_ * auVar113._12_4_ * auVar14._12_4_ * auVar80._12_4_;
  auVar15 = vsubps_avx(auVar324,auVar226);
  auVar113 = vsubps_avx(auVar98,auVar114);
  auVar176 = vshufps_avx(auVar149,auVar149,0xff);
  auVar14 = vshufps_avx(_local_5f8,_local_5f8,0xff);
  auVar147._0_4_ = auVar14._0_4_ * fVar135;
  auVar147._4_4_ = auVar14._4_4_ * fVar160;
  auVar147._8_4_ = auVar14._8_4_ * fVar161;
  auVar147._12_4_ = auVar14._12_4_ * fVar162;
  auVar115._0_4_ =
       auVar176._0_4_ * fVar135 + auVar14._0_4_ * auVar89._0_4_ * auVar79._0_4_ * auVar123._0_4_;
  auVar115._4_4_ =
       auVar176._4_4_ * fVar160 + auVar14._4_4_ * auVar89._4_4_ * auVar79._4_4_ * auVar123._4_4_;
  auVar115._8_4_ =
       auVar176._8_4_ * fVar161 + auVar14._8_4_ * auVar89._8_4_ * auVar79._8_4_ * auVar123._8_4_;
  auVar115._12_4_ =
       auVar176._12_4_ * fVar162 +
       auVar14._12_4_ * auVar89._12_4_ * auVar79._12_4_ * auVar123._12_4_;
  auVar176 = vsubps_avx(_local_5f8,auVar147);
  auVar341._0_4_ = (float)local_5f8._0_4_ + auVar147._0_4_;
  auVar341._4_4_ = (float)local_5f8._4_4_ + auVar147._4_4_;
  auVar341._8_4_ = fStack_5f0 + auVar147._8_4_;
  auVar341._12_4_ = fStack_5ec + auVar147._12_4_;
  auVar14 = vsubps_avx(auVar149,auVar115);
  local_548 = auVar186._0_4_;
  fStack_544 = auVar186._4_4_;
  fStack_540 = auVar186._8_4_;
  fStack_53c = auVar186._12_4_;
  local_438 = auVar16._0_4_;
  fStack_434 = auVar16._4_4_;
  fStack_430 = auVar16._8_4_;
  fStack_42c = auVar16._12_4_;
  auVar123 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
  auVar89 = vshufps_avx(ZEXT416((uint)(1.0 - fVar197)),ZEXT416((uint)(1.0 - fVar197)),0);
  fVar135 = auVar123._0_4_;
  fVar160 = auVar123._4_4_;
  fVar161 = auVar123._8_4_;
  fVar162 = auVar123._12_4_;
  fVar163 = auVar89._0_4_;
  fVar194 = auVar89._4_4_;
  fVar195 = auVar89._8_4_;
  fVar196 = auVar89._12_4_;
  local_3c8._0_4_ = fVar163 * local_438 + fVar135 * auVar15._0_4_;
  local_3c8._4_4_ = fVar194 * fStack_434 + fVar160 * auVar15._4_4_;
  fStack_3c0 = fVar195 * fStack_430 + fVar161 * auVar15._8_4_;
  fStack_3bc = fVar196 * fStack_42c + fVar162 * auVar15._12_4_;
  fVar219 = fVar163 * (local_438 + local_548 * 0.33333334) +
            fVar135 * (auVar15._0_4_ + auVar113._0_4_ * 0.33333334);
  fVar134 = fVar194 * (fStack_434 + fStack_544 * 0.33333334) +
            fVar160 * (auVar15._4_4_ + auVar113._4_4_ * 0.33333334);
  fVar319 = fVar195 * (fStack_430 + fStack_540 * 0.33333334) +
            fVar161 * (auVar15._8_4_ + auVar113._8_4_ * 0.33333334);
  fVar308 = fVar196 * (fStack_42c + fStack_53c * 0.33333334) +
            fVar162 * (auVar15._12_4_ + auVar113._12_4_ * 0.33333334);
  local_568 = auVar185._0_4_;
  fStack_564 = auVar185._4_4_;
  fStack_560 = auVar185._8_4_;
  fStack_55c = auVar185._12_4_;
  auVar177._0_4_ = local_568 * 0.33333334;
  auVar177._4_4_ = fStack_564 * 0.33333334;
  auVar177._8_4_ = fStack_560 * 0.33333334;
  auVar177._12_4_ = fStack_55c * 0.33333334;
  auVar123 = vsubps_avx(auVar122,auVar177);
  auVar246._0_4_ = (fVar352 + auVar90._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar358 + auVar90._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar360 + auVar90._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar362 + auVar90._12_4_) * 0.33333334;
  auVar89 = vsubps_avx(_local_518,auVar246);
  auVar227._0_4_ = auVar14._0_4_ * 0.33333334;
  auVar227._4_4_ = auVar14._4_4_ * 0.33333334;
  auVar227._8_4_ = auVar14._8_4_ * 0.33333334;
  auVar227._12_4_ = auVar14._12_4_ * 0.33333334;
  auVar14 = vsubps_avx(auVar176,auVar227);
  auVar116._0_4_ = (fVar217 + auVar115._0_4_) * 0.33333334;
  auVar116._4_4_ = (fVar237 + auVar115._4_4_) * 0.33333334;
  auVar116._8_4_ = (fVar309 + auVar115._8_4_) * 0.33333334;
  auVar116._12_4_ = (fVar317 + auVar115._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar341,auVar116);
  local_3d8._0_4_ = fVar163 * auVar123._0_4_ + fVar135 * auVar14._0_4_;
  local_3d8._4_4_ = fVar194 * auVar123._4_4_ + fVar160 * auVar14._4_4_;
  fStack_3d0 = fVar195 * auVar123._8_4_ + fVar161 * auVar14._8_4_;
  fStack_3cc = fVar196 * auVar123._12_4_ + fVar162 * auVar14._12_4_;
  local_3e8._0_4_ = auVar176._0_4_ * fVar135 + fVar163 * auVar122._0_4_;
  local_3e8._4_4_ = auVar176._4_4_ * fVar160 + fVar194 * auVar122._4_4_;
  fStack_3e0 = auVar176._8_4_ * fVar161 + fVar195 * auVar122._8_4_;
  fStack_3dc = auVar176._12_4_ * fVar162 + fVar196 * auVar122._12_4_;
  local_3f8._0_4_ =
       fVar163 * (auVar311._0_4_ + auVar263._0_4_) + fVar135 * (auVar324._0_4_ + auVar226._0_4_);
  local_3f8._4_4_ =
       fVar194 * (auVar311._4_4_ + auVar263._4_4_) + fVar160 * (auVar324._4_4_ + auVar226._4_4_);
  fStack_3f0 = fVar195 * (auVar311._8_4_ + auVar263._8_4_) +
               fVar161 * (auVar324._8_4_ + auVar226._8_4_);
  fStack_3ec = fVar196 * (auVar311._12_4_ + auVar263._12_4_) +
               fVar162 * (auVar324._12_4_ + auVar226._12_4_);
  fVar237 = fVar163 * (auVar311._0_4_ + auVar263._0_4_ + (fVar216 + auVar170._0_4_) * 0.33333334) +
            ((fVar318 + auVar114._0_4_) * 0.33333334 + auVar324._0_4_ + auVar226._0_4_) * fVar135;
  fVar309 = fVar194 * (auVar311._4_4_ + auVar263._4_4_ + (fVar218 + auVar170._4_4_) * 0.33333334) +
            ((fVar297 + auVar114._4_4_) * 0.33333334 + auVar324._4_4_ + auVar226._4_4_) * fVar160;
  fVar297 = fVar195 * (auVar311._8_4_ + auVar263._8_4_ + (fVar238 + auVar170._8_4_) * 0.33333334) +
            ((fVar306 + auVar114._8_4_) * 0.33333334 + auVar324._8_4_ + auVar226._8_4_) * fVar161;
  fVar320 = fVar196 * (auVar311._12_4_ + auVar263._12_4_ + (fVar239 + auVar170._12_4_) * 0.33333334)
            + ((fVar307 + auVar114._12_4_) * 0.33333334 + auVar324._12_4_ + auVar226._12_4_) *
              fVar162;
  fVar238 = fVar163 * auVar89._0_4_ + fVar135 * auVar15._0_4_;
  fVar317 = fVar194 * auVar89._4_4_ + fVar160 * auVar15._4_4_;
  fVar306 = fVar195 * auVar89._8_4_ + fVar161 * auVar15._8_4_;
  fVar326 = fVar196 * auVar89._12_4_ + fVar162 * auVar15._12_4_;
  fVar239 = fVar163 * (auVar299._0_4_ + auVar224._0_4_) + auVar341._0_4_ * fVar135;
  fVar318 = fVar194 * (auVar299._4_4_ + auVar224._4_4_) + auVar341._4_4_ * fVar160;
  fVar307 = fVar195 * (auVar299._8_4_ + auVar224._8_4_) + auVar341._8_4_ * fVar161;
  fVar328 = fVar196 * (auVar299._12_4_ + auVar224._12_4_) + auVar341._12_4_ * fVar162;
  auVar123 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar123 = vinsertps_avx(auVar123,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3c8,auVar123);
  auVar176 = vmovsldup_avx(local_268);
  auVar89 = vmovshdup_avx(local_268);
  auVar14 = vshufps_avx(local_268,local_268,0xaa);
  fVar135 = pre->ray_space[k].vx.field_0.m128[0];
  fVar160 = pre->ray_space[k].vx.field_0.m128[1];
  fVar161 = pre->ray_space[k].vx.field_0.m128[2];
  fVar162 = pre->ray_space[k].vx.field_0.m128[3];
  fVar163 = pre->ray_space[k].vy.field_0.m128[0];
  fVar194 = pre->ray_space[k].vy.field_0.m128[1];
  fVar195 = pre->ray_space[k].vy.field_0.m128[2];
  fVar196 = pre->ray_space[k].vy.field_0.m128[3];
  fVar197 = pre->ray_space[k].vz.field_0.m128[0];
  fVar216 = pre->ray_space[k].vz.field_0.m128[1];
  fVar217 = pre->ray_space[k].vz.field_0.m128[2];
  fVar218 = pre->ray_space[k].vz.field_0.m128[3];
  local_4d8._0_4_ = fVar135 * auVar176._0_4_ + fVar163 * auVar89._0_4_ + fVar197 * auVar14._0_4_;
  local_4d8._4_4_ = fVar160 * auVar176._4_4_ + fVar194 * auVar89._4_4_ + fVar216 * auVar14._4_4_;
  fStack_4d0 = fVar161 * auVar176._8_4_ + fVar195 * auVar89._8_4_ + fVar217 * auVar14._8_4_;
  fStack_4cc = fVar162 * auVar176._12_4_ + fVar196 * auVar89._12_4_ + fVar218 * auVar14._12_4_;
  auVar63._4_4_ = fVar134;
  auVar63._0_4_ = fVar219;
  auVar63._8_4_ = fVar319;
  auVar63._12_4_ = fVar308;
  local_278 = vsubps_avx(auVar63,auVar123);
  auVar14 = vshufps_avx(local_278,local_278,0xaa);
  auVar89 = vmovshdup_avx(local_278);
  auVar176 = vmovsldup_avx(local_278);
  auVar342._0_8_ =
       CONCAT44(fVar160 * auVar176._4_4_ + fVar194 * auVar89._4_4_ + fVar216 * auVar14._4_4_,
                fVar135 * auVar176._0_4_ + fVar163 * auVar89._0_4_ + fVar197 * auVar14._0_4_);
  auVar342._8_4_ = fVar161 * auVar176._8_4_ + fVar195 * auVar89._8_4_ + fVar217 * auVar14._8_4_;
  auVar342._12_4_ = fVar162 * auVar176._12_4_ + fVar196 * auVar89._12_4_ + fVar218 * auVar14._12_4_;
  local_288 = vsubps_avx(_local_3d8,auVar123);
  auVar14 = vshufps_avx(local_288,local_288,0xaa);
  auVar89 = vmovshdup_avx(local_288);
  auVar176 = vmovsldup_avx(local_288);
  auVar354._0_4_ = fVar135 * auVar176._0_4_ + fVar163 * auVar89._0_4_ + fVar197 * auVar14._0_4_;
  auVar354._4_4_ = fVar160 * auVar176._4_4_ + fVar194 * auVar89._4_4_ + fVar216 * auVar14._4_4_;
  auVar354._8_4_ = fVar161 * auVar176._8_4_ + fVar195 * auVar89._8_4_ + fVar217 * auVar14._8_4_;
  auVar354._12_4_ = fVar162 * auVar176._12_4_ + fVar196 * auVar89._12_4_ + fVar218 * auVar14._12_4_;
  local_298 = vsubps_avx(_local_3e8,auVar123);
  auVar14 = vshufps_avx(local_298,local_298,0xaa);
  auVar89 = vmovshdup_avx(local_298);
  auVar176 = vmovsldup_avx(local_298);
  auVar117._0_4_ = auVar176._0_4_ * fVar135 + auVar89._0_4_ * fVar163 + fVar197 * auVar14._0_4_;
  auVar117._4_4_ = auVar176._4_4_ * fVar160 + auVar89._4_4_ * fVar194 + fVar216 * auVar14._4_4_;
  auVar117._8_4_ = auVar176._8_4_ * fVar161 + auVar89._8_4_ * fVar195 + fVar217 * auVar14._8_4_;
  auVar117._12_4_ = auVar176._12_4_ * fVar162 + auVar89._12_4_ * fVar196 + fVar218 * auVar14._12_4_;
  local_2a8 = vsubps_avx(_local_3f8,auVar123);
  auVar14 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar89 = vmovshdup_avx(local_2a8);
  auVar176 = vmovsldup_avx(local_2a8);
  auVar274._0_4_ = auVar176._0_4_ * fVar135 + auVar89._0_4_ * fVar163 + auVar14._0_4_ * fVar197;
  auVar274._4_4_ = auVar176._4_4_ * fVar160 + auVar89._4_4_ * fVar194 + auVar14._4_4_ * fVar216;
  auVar274._8_4_ = auVar176._8_4_ * fVar161 + auVar89._8_4_ * fVar195 + auVar14._8_4_ * fVar217;
  auVar274._12_4_ = auVar176._12_4_ * fVar162 + auVar89._12_4_ * fVar196 + auVar14._12_4_ * fVar218;
  auVar61._4_4_ = fVar309;
  auVar61._0_4_ = fVar237;
  auVar61._8_4_ = fVar297;
  auVar61._12_4_ = fVar320;
  local_2b8 = vsubps_avx(auVar61,auVar123);
  auVar14 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar89 = vmovshdup_avx(local_2b8);
  auVar176 = vmovsldup_avx(local_2b8);
  auVar287._0_4_ = auVar176._0_4_ * fVar135 + auVar89._0_4_ * fVar163 + auVar14._0_4_ * fVar197;
  auVar287._4_4_ = auVar176._4_4_ * fVar160 + auVar89._4_4_ * fVar194 + auVar14._4_4_ * fVar216;
  auVar287._8_4_ = auVar176._8_4_ * fVar161 + auVar89._8_4_ * fVar195 + auVar14._8_4_ * fVar217;
  auVar287._12_4_ = auVar176._12_4_ * fVar162 + auVar89._12_4_ * fVar196 + auVar14._12_4_ * fVar218;
  auVar59._4_4_ = fVar317;
  auVar59._0_4_ = fVar238;
  auVar59._8_4_ = fVar306;
  auVar59._12_4_ = fVar326;
  local_2c8 = vsubps_avx(auVar59,auVar123);
  auVar14 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar89 = vmovshdup_avx(local_2c8);
  auVar176 = vmovsldup_avx(local_2c8);
  auVar300._0_4_ = auVar176._0_4_ * fVar135 + auVar89._0_4_ * fVar163 + auVar14._0_4_ * fVar197;
  auVar300._4_4_ = auVar176._4_4_ * fVar160 + auVar89._4_4_ * fVar194 + auVar14._4_4_ * fVar216;
  auVar300._8_4_ = auVar176._8_4_ * fVar161 + auVar89._8_4_ * fVar195 + auVar14._8_4_ * fVar217;
  auVar300._12_4_ = auVar176._12_4_ * fVar162 + auVar89._12_4_ * fVar196 + auVar14._12_4_ * fVar218;
  auVar57._4_4_ = fVar318;
  auVar57._0_4_ = fVar239;
  auVar57._8_4_ = fVar307;
  auVar57._12_4_ = fVar328;
  local_2d8 = vsubps_avx(auVar57,auVar123);
  auVar176 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar123 = vmovshdup_avx(local_2d8);
  auVar89 = vmovsldup_avx(local_2d8);
  auVar96._0_4_ = fVar135 * auVar89._0_4_ + fVar163 * auVar123._0_4_ + fVar197 * auVar176._0_4_;
  auVar96._4_4_ = fVar160 * auVar89._4_4_ + fVar194 * auVar123._4_4_ + fVar216 * auVar176._4_4_;
  auVar96._8_4_ = fVar161 * auVar89._8_4_ + fVar195 * auVar123._8_4_ + fVar217 * auVar176._8_4_;
  auVar96._12_4_ = fVar162 * auVar89._12_4_ + fVar196 * auVar123._12_4_ + fVar218 * auVar176._12_4_;
  auVar14 = vmovlhps_avx(_local_4d8,auVar274);
  auVar15 = vmovlhps_avx(auVar342,auVar287);
  auVar113 = vmovlhps_avx(auVar354,auVar300);
  _local_3b8 = vmovlhps_avx(auVar117,auVar96);
  auVar123 = vminps_avx(auVar14,auVar15);
  auVar89 = vminps_avx(auVar113,_local_3b8);
  auVar176 = vminps_avx(auVar123,auVar89);
  auVar123 = vmaxps_avx(auVar14,auVar15);
  auVar89 = vmaxps_avx(auVar113,_local_3b8);
  auVar123 = vmaxps_avx(auVar123,auVar89);
  auVar89 = vshufpd_avx(auVar176,auVar176,3);
  auVar176 = vminps_avx(auVar176,auVar89);
  auVar89 = vshufpd_avx(auVar123,auVar123,3);
  auVar89 = vmaxps_avx(auVar123,auVar89);
  auVar247._8_4_ = 0x7fffffff;
  auVar247._0_8_ = 0x7fffffff7fffffff;
  auVar247._12_4_ = 0x7fffffff;
  auVar123 = vandps_avx(auVar176,auVar247);
  auVar89 = vandps_avx(auVar89,auVar247);
  auVar123 = vmaxps_avx(auVar123,auVar89);
  auVar89 = vmovshdup_avx(auVar123);
  auVar123 = vmaxss_avx(auVar89,auVar123);
  fVar160 = auVar123._0_4_ * 9.536743e-07;
  register0x00001548 = auVar342._0_8_;
  local_3a8 = auVar342._0_8_;
  auVar123 = vshufps_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),0);
  local_138._16_16_ = auVar123;
  local_138._0_16_ = auVar123;
  auVar97._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
  auVar97._8_4_ = auVar123._8_4_ ^ 0x80000000;
  auVar97._12_4_ = auVar123._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar97;
  local_158._0_16_ = auVar97;
  local_308 = vshufps_avx(ZEXT416(uVar71),ZEXT416(uVar71),0);
  local_318 = vshufps_avx(ZEXT416(uVar69),ZEXT416(uVar69),0);
  bVar67 = false;
  uVar72 = 0;
  fVar135 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar14);
  _local_248 = vsubps_avx(auVar113,auVar15);
  _local_258 = vsubps_avx(_local_3b8,auVar113);
  _local_328 = vsubps_avx(_local_3f8,_local_3c8);
  auVar62._4_4_ = fVar309;
  auVar62._0_4_ = fVar237;
  auVar62._8_4_ = fVar297;
  auVar62._12_4_ = fVar320;
  auVar64._4_4_ = fVar134;
  auVar64._0_4_ = fVar219;
  auVar64._8_4_ = fVar319;
  auVar64._12_4_ = fVar308;
  _local_338 = vsubps_avx(auVar62,auVar64);
  auVar60._4_4_ = fVar317;
  auVar60._0_4_ = fVar238;
  auVar60._8_4_ = fVar306;
  auVar60._12_4_ = fVar326;
  _local_348 = vsubps_avx(auVar60,_local_3d8);
  auVar58._4_4_ = fVar318;
  auVar58._0_4_ = fVar239;
  auVar58._8_4_ = fVar307;
  auVar58._12_4_ = fVar328;
  _local_358 = vsubps_avx(auVar58,_local_3e8);
  local_5b8 = ZEXT816(0x3f80000000000000);
  local_2e8 = local_5b8;
  do {
    auVar123 = vshufps_avx(local_5b8,local_5b8,0x50);
    auVar366._8_4_ = 0x3f800000;
    auVar366._0_8_ = &DAT_3f8000003f800000;
    auVar366._12_4_ = 0x3f800000;
    auVar369._16_4_ = 0x3f800000;
    auVar369._0_16_ = auVar366;
    auVar369._20_4_ = 0x3f800000;
    auVar369._24_4_ = 0x3f800000;
    auVar369._28_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar366,auVar123);
    fVar161 = auVar123._0_4_;
    fVar162 = auVar123._4_4_;
    fVar163 = auVar123._8_4_;
    fVar194 = auVar123._12_4_;
    fVar195 = auVar89._0_4_;
    fVar196 = auVar89._4_4_;
    fVar197 = auVar89._8_4_;
    fVar216 = auVar89._12_4_;
    auVar148._0_4_ = auVar274._0_4_ * fVar161 + fVar195 * (float)local_4d8._0_4_;
    auVar148._4_4_ = auVar274._4_4_ * fVar162 + fVar196 * (float)local_4d8._4_4_;
    auVar148._8_4_ = auVar274._0_4_ * fVar163 + fVar197 * (float)local_4d8._0_4_;
    auVar148._12_4_ = auVar274._4_4_ * fVar194 + fVar216 * (float)local_4d8._4_4_;
    auVar118._0_4_ = auVar287._0_4_ * fVar161 + local_3a8._0_4_ * fVar195;
    auVar118._4_4_ = auVar287._4_4_ * fVar162 + local_3a8._4_4_ * fVar196;
    auVar118._8_4_ = auVar287._0_4_ * fVar163 + local_3a8._8_4_ * fVar197;
    auVar118._12_4_ = auVar287._4_4_ * fVar194 + local_3a8._12_4_ * fVar216;
    auVar205._0_4_ = auVar300._0_4_ * fVar161 + auVar354._0_4_ * fVar195;
    auVar205._4_4_ = auVar300._4_4_ * fVar162 + auVar354._4_4_ * fVar196;
    auVar205._8_4_ = auVar300._0_4_ * fVar163 + auVar354._0_4_ * fVar197;
    auVar205._12_4_ = auVar300._4_4_ * fVar194 + auVar354._4_4_ * fVar216;
    auVar178._0_4_ = auVar96._0_4_ * fVar161 + auVar117._0_4_ * fVar195;
    auVar178._4_4_ = auVar96._4_4_ * fVar162 + auVar117._4_4_ * fVar196;
    auVar178._8_4_ = auVar96._0_4_ * fVar163 + auVar117._0_4_ * fVar197;
    auVar178._12_4_ = auVar96._4_4_ * fVar194 + auVar117._4_4_ * fVar216;
    auVar123 = vmovshdup_avx(local_2e8);
    auVar89 = vshufps_avx(local_2e8,local_2e8,0);
    auVar283._16_16_ = auVar89;
    auVar283._0_16_ = auVar89;
    auVar176 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar102._16_16_ = auVar176;
    auVar102._0_16_ = auVar176;
    auVar101 = vsubps_avx(auVar102,auVar283);
    auVar176 = vshufps_avx(auVar148,auVar148,0);
    auVar186 = vshufps_avx(auVar148,auVar148,0x55);
    auVar122 = vshufps_avx(auVar118,auVar118,0);
    auVar185 = vshufps_avx(auVar118,auVar118,0x55);
    auVar98 = vshufps_avx(auVar205,auVar205,0);
    auVar149 = vshufps_avx(auVar205,auVar205,0x55);
    auVar16 = vshufps_avx(auVar178,auVar178,0);
    auVar79 = vshufps_avx(auVar178,auVar178,0x55);
    auVar123 = ZEXT416((uint)((auVar123._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar123 = vshufps_avx(auVar123,auVar123,0);
    auVar296._0_4_ = auVar89._0_4_ + auVar101._0_4_ * 0.0;
    auVar296._4_4_ = auVar89._4_4_ + auVar101._4_4_ * 0.14285715;
    auVar296._8_4_ = auVar89._8_4_ + auVar101._8_4_ * 0.2857143;
    auVar296._12_4_ = auVar89._12_4_ + auVar101._12_4_ * 0.42857146;
    auVar296._16_4_ = auVar89._0_4_ + auVar101._16_4_ * 0.5714286;
    auVar296._20_4_ = auVar89._4_4_ + auVar101._20_4_ * 0.71428573;
    auVar296._24_4_ = auVar89._8_4_ + auVar101._24_4_ * 0.8571429;
    auVar296._28_4_ = auVar89._12_4_ + auVar101._28_4_;
    auVar19 = vsubps_avx(auVar369,auVar296);
    fVar348 = auVar122._0_4_;
    fVar352 = auVar122._4_4_;
    fVar371 = auVar122._8_4_;
    fVar375 = auVar122._12_4_;
    fVar161 = auVar19._0_4_;
    fVar195 = auVar19._4_4_;
    fVar217 = auVar19._8_4_;
    fVar347 = auVar19._12_4_;
    fVar350 = auVar176._12_4_;
    fVar358 = auVar19._16_4_;
    fVar360 = auVar19._20_4_;
    fVar362 = auVar19._24_4_;
    fVar253 = auVar185._0_4_;
    fVar254 = auVar185._4_4_;
    fVar255 = auVar185._8_4_;
    fVar338 = auVar185._12_4_;
    local_4f8 = auVar186._0_4_;
    fStack_4f4 = auVar186._4_4_;
    fStack_4f0 = auVar186._8_4_;
    fStack_4ec = auVar186._12_4_;
    fVar162 = auVar98._0_4_;
    fVar194 = auVar98._4_4_;
    fVar197 = auVar98._8_4_;
    fVar218 = auVar98._12_4_;
    fVar349 = auVar296._0_4_ * fVar162 + fVar348 * fVar161;
    fVar363 = auVar296._4_4_ * fVar194 + fVar352 * fVar195;
    fVar373 = auVar296._8_4_ * fVar197 + fVar371 * fVar217;
    fVar364 = auVar296._12_4_ * fVar218 + fVar375 * fVar347;
    fVar372 = auVar296._16_4_ * fVar162 + fVar348 * fVar358;
    fVar374 = auVar296._20_4_ * fVar194 + fVar352 * fVar360;
    fVar376 = auVar296._24_4_ * fVar197 + fVar371 * fVar362;
    fVar163 = auVar149._0_4_;
    fVar196 = auVar149._4_4_;
    fVar216 = auVar149._8_4_;
    fVar330 = auVar149._12_4_;
    fVar321 = auVar296._0_4_ * fVar163 + fVar253 * fVar161;
    fVar327 = auVar296._4_4_ * fVar196 + fVar254 * fVar195;
    fVar329 = auVar296._8_4_ * fVar216 + fVar255 * fVar217;
    fVar331 = auVar296._12_4_ * fVar330 + fVar338 * fVar347;
    fVar332 = auVar296._16_4_ * fVar163 + fVar253 * fVar358;
    fVar334 = auVar296._20_4_ * fVar196 + fVar254 * fVar360;
    fVar336 = auVar296._24_4_ * fVar216 + fVar255 * fVar362;
    auVar89 = vshufps_avx(auVar148,auVar148,0xaa);
    auVar186 = vshufps_avx(auVar148,auVar148,0xff);
    fVar339 = fVar218 + 0.0;
    auVar122 = vshufps_avx(auVar118,auVar118,0xaa);
    auVar185 = vshufps_avx(auVar118,auVar118,0xff);
    auVar103._0_4_ =
         fVar161 * (fVar348 * auVar296._0_4_ + auVar176._0_4_ * fVar161) + auVar296._0_4_ * fVar349;
    auVar103._4_4_ =
         fVar195 * (fVar352 * auVar296._4_4_ + auVar176._4_4_ * fVar195) + auVar296._4_4_ * fVar363;
    auVar103._8_4_ =
         fVar217 * (fVar371 * auVar296._8_4_ + auVar176._8_4_ * fVar217) + auVar296._8_4_ * fVar373;
    auVar103._12_4_ =
         fVar347 * (fVar375 * auVar296._12_4_ + fVar350 * fVar347) + auVar296._12_4_ * fVar364;
    auVar103._16_4_ =
         fVar358 * (fVar348 * auVar296._16_4_ + auVar176._0_4_ * fVar358) +
         auVar296._16_4_ * fVar372;
    auVar103._20_4_ =
         fVar360 * (fVar352 * auVar296._20_4_ + auVar176._4_4_ * fVar360) +
         auVar296._20_4_ * fVar374;
    auVar103._24_4_ =
         fVar362 * (fVar371 * auVar296._24_4_ + auVar176._8_4_ * fVar362) +
         auVar296._24_4_ * fVar376;
    auVar103._28_4_ = fVar350 + 1.0 + fVar330;
    auVar190._0_4_ =
         fVar161 * (fVar253 * auVar296._0_4_ + fVar161 * local_4f8) + auVar296._0_4_ * fVar321;
    auVar190._4_4_ =
         fVar195 * (fVar254 * auVar296._4_4_ + fVar195 * fStack_4f4) + auVar296._4_4_ * fVar327;
    auVar190._8_4_ =
         fVar217 * (fVar255 * auVar296._8_4_ + fVar217 * fStack_4f0) + auVar296._8_4_ * fVar329;
    auVar190._12_4_ =
         fVar347 * (fVar338 * auVar296._12_4_ + fVar347 * fStack_4ec) + auVar296._12_4_ * fVar331;
    auVar190._16_4_ =
         fVar358 * (fVar253 * auVar296._16_4_ + fVar358 * local_4f8) + auVar296._16_4_ * fVar332;
    auVar190._20_4_ =
         fVar360 * (fVar254 * auVar296._20_4_ + fVar360 * fStack_4f4) + auVar296._20_4_ * fVar334;
    auVar190._24_4_ =
         fVar362 * (fVar255 * auVar296._24_4_ + fVar362 * fStack_4f0) + auVar296._24_4_ * fVar336;
    auVar190._28_4_ = fVar350 + 1.0 + fVar330;
    auVar213._0_4_ =
         fVar161 * fVar349 + auVar296._0_4_ * (auVar16._0_4_ * auVar296._0_4_ + fVar161 * fVar162);
    auVar213._4_4_ =
         fVar195 * fVar363 + auVar296._4_4_ * (auVar16._4_4_ * auVar296._4_4_ + fVar195 * fVar194);
    auVar213._8_4_ =
         fVar217 * fVar373 + auVar296._8_4_ * (auVar16._8_4_ * auVar296._8_4_ + fVar217 * fVar197);
    auVar213._12_4_ =
         fVar347 * fVar364 +
         auVar296._12_4_ * (auVar16._12_4_ * auVar296._12_4_ + fVar347 * fVar218);
    auVar213._16_4_ =
         fVar358 * fVar372 + auVar296._16_4_ * (auVar16._0_4_ * auVar296._16_4_ + fVar358 * fVar162)
    ;
    auVar213._20_4_ =
         fVar360 * fVar374 + auVar296._20_4_ * (auVar16._4_4_ * auVar296._20_4_ + fVar360 * fVar194)
    ;
    auVar213._24_4_ =
         fVar362 * fVar376 + auVar296._24_4_ * (auVar16._8_4_ * auVar296._24_4_ + fVar362 * fVar197)
    ;
    auVar213._28_4_ = fVar330 + fVar339;
    auVar305._0_4_ =
         fVar161 * fVar321 + auVar296._0_4_ * (auVar79._0_4_ * auVar296._0_4_ + fVar161 * fVar163);
    auVar305._4_4_ =
         fVar195 * fVar327 + auVar296._4_4_ * (auVar79._4_4_ * auVar296._4_4_ + fVar195 * fVar196);
    auVar305._8_4_ =
         fVar217 * fVar329 + auVar296._8_4_ * (auVar79._8_4_ * auVar296._8_4_ + fVar217 * fVar216);
    auVar305._12_4_ =
         fVar347 * fVar331 +
         auVar296._12_4_ * (auVar79._12_4_ * auVar296._12_4_ + fVar347 * fVar330);
    auVar305._16_4_ =
         fVar358 * fVar332 + auVar296._16_4_ * (auVar79._0_4_ * auVar296._16_4_ + fVar358 * fVar163)
    ;
    auVar305._20_4_ =
         fVar360 * fVar334 + auVar296._20_4_ * (auVar79._4_4_ * auVar296._20_4_ + fVar360 * fVar196)
    ;
    auVar305._24_4_ =
         fVar362 * fVar336 + auVar296._24_4_ * (auVar79._8_4_ * auVar296._24_4_ + fVar362 * fVar216)
    ;
    auVar305._28_4_ = fVar339 + fVar330 + 0.0;
    local_78._0_4_ = fVar161 * auVar103._0_4_ + auVar296._0_4_ * auVar213._0_4_;
    local_78._4_4_ = fVar195 * auVar103._4_4_ + auVar296._4_4_ * auVar213._4_4_;
    local_78._8_4_ = fVar217 * auVar103._8_4_ + auVar296._8_4_ * auVar213._8_4_;
    local_78._12_4_ = fVar347 * auVar103._12_4_ + auVar296._12_4_ * auVar213._12_4_;
    local_78._16_4_ = fVar358 * auVar103._16_4_ + auVar296._16_4_ * auVar213._16_4_;
    local_78._20_4_ = fVar360 * auVar103._20_4_ + auVar296._20_4_ * auVar213._20_4_;
    local_78._24_4_ = fVar362 * auVar103._24_4_ + auVar296._24_4_ * auVar213._24_4_;
    local_78._28_4_ = fVar350 + fVar375 + fVar330 + 0.0;
    local_98._0_4_ = fVar161 * auVar190._0_4_ + auVar296._0_4_ * auVar305._0_4_;
    local_98._4_4_ = fVar195 * auVar190._4_4_ + auVar296._4_4_ * auVar305._4_4_;
    local_98._8_4_ = fVar217 * auVar190._8_4_ + auVar296._8_4_ * auVar305._8_4_;
    local_98._12_4_ = fVar347 * auVar190._12_4_ + auVar296._12_4_ * auVar305._12_4_;
    local_98._16_4_ = fVar358 * auVar190._16_4_ + auVar296._16_4_ * auVar305._16_4_;
    local_98._20_4_ = fVar360 * auVar190._20_4_ + auVar296._20_4_ * auVar305._20_4_;
    local_98._24_4_ = fVar362 * auVar190._24_4_ + auVar296._24_4_ * auVar305._24_4_;
    local_98._28_4_ = fVar350 + fVar375 + fVar339;
    auVar20 = vsubps_avx(auVar213,auVar103);
    auVar101 = vsubps_avx(auVar305,auVar190);
    local_548 = auVar123._0_4_;
    fStack_544 = auVar123._4_4_;
    fStack_540 = auVar123._8_4_;
    fStack_53c = auVar123._12_4_;
    local_d8 = local_548 * auVar20._0_4_ * 3.0;
    fStack_d4 = fStack_544 * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_d4;
    auVar21._0_4_ = local_d8;
    fStack_d0 = fStack_540 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_d0;
    fStack_cc = fStack_53c * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_cc;
    fStack_c8 = local_548 * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_c8;
    fStack_c4 = fStack_544 * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_c4;
    fStack_c0 = fStack_540 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_c0;
    auVar21._28_4_ = auVar20._28_4_;
    fVar363 = local_548 * auVar101._0_4_ * 3.0;
    fVar371 = fStack_544 * auVar101._4_4_ * 3.0;
    auVar22._4_4_ = fVar371;
    auVar22._0_4_ = fVar363;
    fVar373 = fStack_540 * auVar101._8_4_ * 3.0;
    auVar22._8_4_ = fVar373;
    fVar375 = fStack_53c * auVar101._12_4_ * 3.0;
    auVar22._12_4_ = fVar375;
    fVar364 = local_548 * auVar101._16_4_ * 3.0;
    auVar22._16_4_ = fVar364;
    fVar372 = fStack_544 * auVar101._20_4_ * 3.0;
    auVar22._20_4_ = fVar372;
    fVar374 = fStack_540 * auVar101._24_4_ * 3.0;
    auVar22._24_4_ = fVar374;
    auVar22._28_4_ = auVar213._28_4_;
    auVar21 = vsubps_avx(local_78,auVar21);
    auVar101 = vperm2f128_avx(auVar21,auVar21,1);
    auVar101 = vshufps_avx(auVar101,auVar21,0x30);
    auVar101 = vshufps_avx(auVar21,auVar101,0x29);
    auVar22 = vsubps_avx(local_98,auVar22);
    auVar21 = vperm2f128_avx(auVar22,auVar22,1);
    auVar21 = vshufps_avx(auVar21,auVar22,0x30);
    auVar102 = vshufps_avx(auVar22,auVar21,0x29);
    fVar353 = auVar122._0_4_;
    fVar359 = auVar122._4_4_;
    fVar361 = auVar122._8_4_;
    fVar162 = auVar185._0_4_;
    fVar196 = auVar185._4_4_;
    fVar218 = auVar185._8_4_;
    fVar348 = auVar185._12_4_;
    fVar351 = auVar186._12_4_;
    auVar123 = vshufps_avx(auVar205,auVar205,0xaa);
    fVar163 = auVar123._0_4_;
    fVar197 = auVar123._4_4_;
    fVar330 = auVar123._8_4_;
    fVar349 = auVar123._12_4_;
    fVar331 = auVar296._0_4_ * fVar163 + fVar353 * fVar161;
    fVar332 = auVar296._4_4_ * fVar197 + fVar359 * fVar195;
    fVar334 = auVar296._8_4_ * fVar330 + fVar361 * fVar217;
    fVar336 = auVar296._12_4_ * fVar349 + auVar122._12_4_ * fVar347;
    fVar333 = auVar296._16_4_ * fVar163 + fVar353 * fVar358;
    fVar335 = auVar296._20_4_ * fVar197 + fVar359 * fVar360;
    fVar337 = auVar296._24_4_ * fVar330 + fVar361 * fVar362;
    fVar338 = fVar351 + fVar350 + fVar338;
    auVar123 = vshufps_avx(auVar205,auVar205,0xff);
    fVar194 = auVar123._0_4_;
    fVar216 = auVar123._4_4_;
    fVar339 = auVar123._8_4_;
    fVar352 = auVar123._12_4_;
    fVar376 = auVar296._0_4_ * fVar194 + fVar161 * fVar162;
    fVar253 = auVar296._4_4_ * fVar216 + fVar195 * fVar196;
    fVar321 = auVar296._8_4_ * fVar339 + fVar217 * fVar218;
    fVar254 = auVar296._12_4_ * fVar352 + fVar347 * fVar348;
    fVar327 = auVar296._16_4_ * fVar194 + fVar358 * fVar162;
    fVar255 = auVar296._20_4_ * fVar216 + fVar360 * fVar196;
    fVar329 = auVar296._24_4_ * fVar339 + fVar362 * fVar218;
    auVar123 = vshufps_avx(auVar178,auVar178,0xaa);
    auVar176 = vshufps_avx(auVar178,auVar178,0xff);
    fVar350 = auVar176._12_4_;
    auVar104._0_4_ =
         auVar296._0_4_ * fVar331 + fVar161 * (fVar353 * auVar296._0_4_ + auVar89._0_4_ * fVar161);
    auVar104._4_4_ =
         auVar296._4_4_ * fVar332 + fVar195 * (fVar359 * auVar296._4_4_ + auVar89._4_4_ * fVar195);
    auVar104._8_4_ =
         auVar296._8_4_ * fVar334 + fVar217 * (fVar361 * auVar296._8_4_ + auVar89._8_4_ * fVar217);
    auVar104._12_4_ =
         auVar296._12_4_ * fVar336 +
         fVar347 * (auVar122._12_4_ * auVar296._12_4_ + auVar89._12_4_ * fVar347);
    auVar104._16_4_ =
         auVar296._16_4_ * fVar333 + fVar358 * (fVar353 * auVar296._16_4_ + auVar89._0_4_ * fVar358)
    ;
    auVar104._20_4_ =
         auVar296._20_4_ * fVar335 + fVar360 * (fVar359 * auVar296._20_4_ + auVar89._4_4_ * fVar360)
    ;
    auVar104._24_4_ =
         auVar296._24_4_ * fVar337 + fVar362 * (fVar361 * auVar296._24_4_ + auVar89._8_4_ * fVar362)
    ;
    auVar104._28_4_ = fVar350 + auVar22._28_4_ + auVar21._28_4_;
    auVar346._0_4_ =
         auVar296._0_4_ * fVar376 + fVar161 * (auVar296._0_4_ * fVar162 + auVar186._0_4_ * fVar161);
    auVar346._4_4_ =
         auVar296._4_4_ * fVar253 + fVar195 * (auVar296._4_4_ * fVar196 + auVar186._4_4_ * fVar195);
    auVar346._8_4_ =
         auVar296._8_4_ * fVar321 + fVar217 * (auVar296._8_4_ * fVar218 + auVar186._8_4_ * fVar217);
    auVar346._12_4_ =
         auVar296._12_4_ * fVar254 + fVar347 * (auVar296._12_4_ * fVar348 + fVar351 * fVar347);
    auVar346._16_4_ =
         auVar296._16_4_ * fVar327 +
         fVar358 * (auVar296._16_4_ * fVar162 + auVar186._0_4_ * fVar358);
    auVar346._20_4_ =
         auVar296._20_4_ * fVar255 +
         fVar360 * (auVar296._20_4_ * fVar196 + auVar186._4_4_ * fVar360);
    auVar346._24_4_ =
         auVar296._24_4_ * fVar329 +
         fVar362 * (auVar296._24_4_ * fVar218 + auVar186._8_4_ * fVar362);
    auVar346._28_4_ = fVar350 + auVar21._28_4_ + auVar213._28_4_;
    auVar21 = vperm2f128_avx(local_78,local_78,1);
    auVar21 = vshufps_avx(auVar21,local_78,0x30);
    auVar103 = vshufps_avx(local_78,auVar21,0x29);
    auVar214._0_4_ =
         fVar161 * fVar331 + auVar296._0_4_ * (auVar123._0_4_ * auVar296._0_4_ + fVar161 * fVar163);
    auVar214._4_4_ =
         fVar195 * fVar332 + auVar296._4_4_ * (auVar123._4_4_ * auVar296._4_4_ + fVar195 * fVar197);
    auVar214._8_4_ =
         fVar217 * fVar334 + auVar296._8_4_ * (auVar123._8_4_ * auVar296._8_4_ + fVar217 * fVar330);
    auVar214._12_4_ =
         fVar347 * fVar336 +
         auVar296._12_4_ * (auVar123._12_4_ * auVar296._12_4_ + fVar347 * fVar349);
    auVar214._16_4_ =
         fVar358 * fVar333 +
         auVar296._16_4_ * (auVar123._0_4_ * auVar296._16_4_ + fVar358 * fVar163);
    auVar214._20_4_ =
         fVar360 * fVar335 +
         auVar296._20_4_ * (auVar123._4_4_ * auVar296._20_4_ + fVar360 * fVar197);
    auVar214._24_4_ =
         fVar362 * fVar337 +
         auVar296._24_4_ * (auVar123._8_4_ * auVar296._24_4_ + fVar362 * fVar330);
    auVar214._28_4_ = fVar338 + auVar123._12_4_ + fVar349;
    auVar252._0_4_ =
         fVar161 * fVar376 + auVar296._0_4_ * (auVar176._0_4_ * auVar296._0_4_ + fVar161 * fVar194);
    auVar252._4_4_ =
         fVar195 * fVar253 + auVar296._4_4_ * (auVar176._4_4_ * auVar296._4_4_ + fVar195 * fVar216);
    auVar252._8_4_ =
         fVar217 * fVar321 + auVar296._8_4_ * (auVar176._8_4_ * auVar296._8_4_ + fVar217 * fVar339);
    auVar252._12_4_ =
         fVar347 * fVar254 + auVar296._12_4_ * (fVar350 * auVar296._12_4_ + fVar347 * fVar352);
    auVar252._16_4_ =
         fVar358 * fVar327 +
         auVar296._16_4_ * (auVar176._0_4_ * auVar296._16_4_ + fVar358 * fVar194);
    auVar252._20_4_ =
         fVar360 * fVar255 +
         auVar296._20_4_ * (auVar176._4_4_ * auVar296._20_4_ + fVar360 * fVar216);
    auVar252._24_4_ =
         fVar362 * fVar329 +
         auVar296._24_4_ * (auVar176._8_4_ * auVar296._24_4_ + fVar362 * fVar339);
    auVar252._28_4_ = fVar351 + fVar348 + fVar350 + fVar352;
    auVar266._0_4_ = fVar161 * auVar104._0_4_ + auVar296._0_4_ * auVar214._0_4_;
    auVar266._4_4_ = fVar195 * auVar104._4_4_ + auVar296._4_4_ * auVar214._4_4_;
    auVar266._8_4_ = fVar217 * auVar104._8_4_ + auVar296._8_4_ * auVar214._8_4_;
    auVar266._12_4_ = fVar347 * auVar104._12_4_ + auVar296._12_4_ * auVar214._12_4_;
    auVar266._16_4_ = fVar358 * auVar104._16_4_ + auVar296._16_4_ * auVar214._16_4_;
    auVar266._20_4_ = fVar360 * auVar104._20_4_ + auVar296._20_4_ * auVar214._20_4_;
    auVar266._24_4_ = fVar362 * auVar104._24_4_ + auVar296._24_4_ * auVar214._24_4_;
    auVar266._28_4_ = fVar338 + fVar350 + fVar352;
    auVar284._0_4_ = fVar161 * auVar346._0_4_ + auVar296._0_4_ * auVar252._0_4_;
    auVar284._4_4_ = fVar195 * auVar346._4_4_ + auVar296._4_4_ * auVar252._4_4_;
    auVar284._8_4_ = fVar217 * auVar346._8_4_ + auVar296._8_4_ * auVar252._8_4_;
    auVar284._12_4_ = fVar347 * auVar346._12_4_ + auVar296._12_4_ * auVar252._12_4_;
    auVar284._16_4_ = fVar358 * auVar346._16_4_ + auVar296._16_4_ * auVar252._16_4_;
    auVar284._20_4_ = fVar360 * auVar346._20_4_ + auVar296._20_4_ * auVar252._20_4_;
    auVar284._24_4_ = fVar362 * auVar346._24_4_ + auVar296._24_4_ * auVar252._24_4_;
    auVar284._28_4_ = auVar19._28_4_ + auVar296._28_4_;
    auVar21 = vsubps_avx(auVar214,auVar104);
    auVar19 = vsubps_avx(auVar252,auVar346);
    local_f8 = local_548 * auVar21._0_4_ * 3.0;
    fStack_f4 = fStack_544 * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_f4;
    auVar17._0_4_ = local_f8;
    fStack_f0 = fStack_540 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_f0;
    fStack_ec = fStack_53c * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_ec;
    fStack_e8 = local_548 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_e8;
    fStack_e4 = fStack_544 * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_e4;
    fStack_e0 = fStack_540 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_e0;
    auVar17._28_4_ = auVar252._28_4_;
    local_118 = local_548 * auVar19._0_4_ * 3.0;
    fStack_114 = fStack_544 * auVar19._4_4_ * 3.0;
    auVar18._4_4_ = fStack_114;
    auVar18._0_4_ = local_118;
    fStack_110 = fStack_540 * auVar19._8_4_ * 3.0;
    auVar18._8_4_ = fStack_110;
    fStack_10c = fStack_53c * auVar19._12_4_ * 3.0;
    auVar18._12_4_ = fStack_10c;
    local_548 = local_548 * auVar19._16_4_ * 3.0;
    auVar18._16_4_ = local_548;
    fStack_544 = fStack_544 * auVar19._20_4_ * 3.0;
    auVar18._20_4_ = fStack_544;
    fStack_540 = fStack_540 * auVar19._24_4_ * 3.0;
    auVar18._24_4_ = fStack_540;
    auVar18._28_4_ = fStack_53c;
    auVar21 = vperm2f128_avx(auVar266,auVar266,1);
    auVar21 = vshufps_avx(auVar21,auVar266,0x30);
    auVar104 = vshufps_avx(auVar266,auVar21,0x29);
    auVar19 = vsubps_avx(auVar266,auVar17);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar17 = vshufps_avx(auVar19,auVar21,0x29);
    auVar19 = vsubps_avx(auVar284,auVar18);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar18 = vshufps_avx(auVar19,auVar21,0x29);
    auVar22 = vsubps_avx(auVar266,local_78);
    auVar23 = vsubps_avx(auVar104,auVar103);
    fVar161 = auVar23._0_4_ + auVar22._0_4_;
    fVar162 = auVar23._4_4_ + auVar22._4_4_;
    fVar163 = auVar23._8_4_ + auVar22._8_4_;
    fVar194 = auVar23._12_4_ + auVar22._12_4_;
    fVar195 = auVar23._16_4_ + auVar22._16_4_;
    fVar196 = auVar23._20_4_ + auVar22._20_4_;
    fVar197 = auVar23._24_4_ + auVar22._24_4_;
    auVar19 = vperm2f128_avx(local_98,local_98,1);
    auVar19 = vshufps_avx(auVar19,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar284,auVar284,1);
    auVar19 = vshufps_avx(auVar19,auVar284,0x30);
    auVar190 = vshufps_avx(auVar284,auVar19,0x29);
    auVar19 = vsubps_avx(auVar284,local_98);
    auVar214 = vsubps_avx(auVar190,local_b8);
    fVar216 = auVar19._0_4_ + auVar214._0_4_;
    fVar217 = auVar19._4_4_ + auVar214._4_4_;
    fVar218 = auVar19._8_4_ + auVar214._8_4_;
    fVar330 = auVar19._12_4_ + auVar214._12_4_;
    fVar339 = auVar19._16_4_ + auVar214._16_4_;
    fVar347 = auVar19._20_4_ + auVar214._20_4_;
    fVar348 = auVar19._24_4_ + auVar214._24_4_;
    fVar349 = auVar19._28_4_;
    auVar19._4_4_ = local_98._4_4_ * fVar162;
    auVar19._0_4_ = local_98._0_4_ * fVar161;
    auVar19._8_4_ = local_98._8_4_ * fVar163;
    auVar19._12_4_ = local_98._12_4_ * fVar194;
    auVar19._16_4_ = local_98._16_4_ * fVar195;
    auVar19._20_4_ = local_98._20_4_ * fVar196;
    auVar19._24_4_ = local_98._24_4_ * fVar197;
    auVar19._28_4_ = fVar349;
    auVar24._4_4_ = fVar217 * local_78._4_4_;
    auVar24._0_4_ = fVar216 * local_78._0_4_;
    auVar24._8_4_ = fVar218 * local_78._8_4_;
    auVar24._12_4_ = fVar330 * local_78._12_4_;
    auVar24._16_4_ = fVar339 * local_78._16_4_;
    auVar24._20_4_ = fVar347 * local_78._20_4_;
    auVar24._24_4_ = fVar348 * local_78._24_4_;
    auVar24._28_4_ = auVar21._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar24);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar20._28_4_;
    fVar363 = local_98._0_4_ + fVar363;
    fVar371 = local_98._4_4_ + fVar371;
    fVar373 = local_98._8_4_ + fVar373;
    fVar375 = local_98._12_4_ + fVar375;
    fVar364 = local_98._16_4_ + fVar364;
    fVar372 = local_98._20_4_ + fVar372;
    fVar374 = local_98._24_4_ + fVar374;
    auVar20._4_4_ = fVar371 * fVar162;
    auVar20._0_4_ = fVar363 * fVar161;
    auVar20._8_4_ = fVar373 * fVar163;
    auVar20._12_4_ = fVar375 * fVar194;
    auVar20._16_4_ = fVar364 * fVar195;
    auVar20._20_4_ = fVar372 * fVar196;
    auVar20._24_4_ = fVar374 * fVar197;
    auVar20._28_4_ = fVar349;
    auVar25._4_4_ = fVar217 * fStack_d4;
    auVar25._0_4_ = fVar216 * local_d8;
    auVar25._8_4_ = fVar218 * fStack_d0;
    auVar25._12_4_ = fVar330 * fStack_cc;
    auVar25._16_4_ = fVar339 * fStack_c8;
    auVar25._20_4_ = fVar347 * fStack_c4;
    auVar25._24_4_ = fVar348 * fStack_c0;
    auVar25._28_4_ = fStack_bc;
    auVar20 = vsubps_avx(auVar20,auVar25);
    auVar26._4_4_ = auVar102._4_4_ * fVar162;
    auVar26._0_4_ = auVar102._0_4_ * fVar161;
    auVar26._8_4_ = auVar102._8_4_ * fVar163;
    auVar26._12_4_ = auVar102._12_4_ * fVar194;
    auVar26._16_4_ = auVar102._16_4_ * fVar195;
    auVar26._20_4_ = auVar102._20_4_ * fVar196;
    auVar26._24_4_ = auVar102._24_4_ * fVar197;
    auVar26._28_4_ = fVar349;
    local_4f8 = auVar101._0_4_;
    fStack_4f4 = auVar101._4_4_;
    fStack_4f0 = auVar101._8_4_;
    fStack_4ec = auVar101._12_4_;
    fStack_4e8 = auVar101._16_4_;
    fStack_4e4 = auVar101._20_4_;
    fStack_4e0 = auVar101._24_4_;
    auVar27._4_4_ = fVar217 * fStack_4f4;
    auVar27._0_4_ = fVar216 * local_4f8;
    auVar27._8_4_ = fVar218 * fStack_4f0;
    auVar27._12_4_ = fVar330 * fStack_4ec;
    auVar27._16_4_ = fVar339 * fStack_4e8;
    auVar27._20_4_ = fVar347 * fStack_4e4;
    auVar27._24_4_ = fVar348 * fStack_4e0;
    auVar27._28_4_ = 0x40400000;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_b8._4_4_ * fVar162;
    auVar28._0_4_ = local_b8._0_4_ * fVar161;
    auVar28._8_4_ = local_b8._8_4_ * fVar163;
    auVar28._12_4_ = local_b8._12_4_ * fVar194;
    auVar28._16_4_ = local_b8._16_4_ * fVar195;
    auVar28._20_4_ = local_b8._20_4_ * fVar196;
    auVar28._24_4_ = local_b8._24_4_ * fVar197;
    auVar28._28_4_ = fVar349;
    auVar29._4_4_ = auVar103._4_4_ * fVar217;
    auVar29._0_4_ = auVar103._0_4_ * fVar216;
    auVar29._8_4_ = auVar103._8_4_ * fVar218;
    auVar29._12_4_ = auVar103._12_4_ * fVar330;
    auVar29._16_4_ = auVar103._16_4_ * fVar339;
    auVar29._20_4_ = auVar103._20_4_ * fVar347;
    auVar29._24_4_ = auVar103._24_4_ * fVar348;
    auVar29._28_4_ = local_b8._28_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar284._4_4_ * fVar162;
    auVar30._0_4_ = auVar284._0_4_ * fVar161;
    auVar30._8_4_ = auVar284._8_4_ * fVar163;
    auVar30._12_4_ = auVar284._12_4_ * fVar194;
    auVar30._16_4_ = auVar284._16_4_ * fVar195;
    auVar30._20_4_ = auVar284._20_4_ * fVar196;
    auVar30._24_4_ = auVar284._24_4_ * fVar197;
    auVar30._28_4_ = fVar349;
    auVar31._4_4_ = fVar217 * auVar266._4_4_;
    auVar31._0_4_ = fVar216 * auVar266._0_4_;
    auVar31._8_4_ = fVar218 * auVar266._8_4_;
    auVar31._12_4_ = fVar330 * auVar266._12_4_;
    auVar31._16_4_ = fVar339 * auVar266._16_4_;
    auVar31._20_4_ = fVar347 * auVar266._20_4_;
    auVar31._24_4_ = fVar348 * auVar266._24_4_;
    auVar31._28_4_ = auVar102._28_4_;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_f8 = auVar266._0_4_ + local_f8;
    fStack_f4 = auVar266._4_4_ + fStack_f4;
    fStack_f0 = auVar266._8_4_ + fStack_f0;
    fStack_ec = auVar266._12_4_ + fStack_ec;
    fStack_e8 = auVar266._16_4_ + fStack_e8;
    fStack_e4 = auVar266._20_4_ + fStack_e4;
    fStack_e0 = auVar266._24_4_ + fStack_e0;
    fStack_dc = auVar266._28_4_ + auVar252._28_4_;
    local_118 = auVar284._0_4_ + local_118;
    fStack_114 = auVar284._4_4_ + fStack_114;
    fStack_110 = auVar284._8_4_ + fStack_110;
    fStack_10c = auVar284._12_4_ + fStack_10c;
    fStack_108 = auVar284._16_4_ + local_548;
    fStack_104 = auVar284._20_4_ + fStack_544;
    fStack_100 = auVar284._24_4_ + fStack_540;
    fStack_fc = auVar284._28_4_ + fStack_53c;
    auVar32._4_4_ = fStack_114 * fVar162;
    auVar32._0_4_ = local_118 * fVar161;
    auVar32._8_4_ = fStack_110 * fVar163;
    auVar32._12_4_ = fStack_10c * fVar194;
    auVar32._16_4_ = fStack_108 * fVar195;
    auVar32._20_4_ = fStack_104 * fVar196;
    auVar32._24_4_ = fStack_100 * fVar197;
    auVar32._28_4_ = auVar284._28_4_ + fStack_53c;
    auVar33._4_4_ = fStack_f4 * fVar217;
    auVar33._0_4_ = local_f8 * fVar216;
    auVar33._8_4_ = fStack_f0 * fVar218;
    auVar33._12_4_ = fStack_ec * fVar330;
    auVar33._16_4_ = fStack_e8 * fVar339;
    auVar33._20_4_ = fStack_e4 * fVar347;
    auVar33._24_4_ = fStack_e0 * fVar348;
    auVar33._28_4_ = fStack_dc;
    auVar27 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar18._4_4_ * fVar162;
    auVar34._0_4_ = auVar18._0_4_ * fVar161;
    auVar34._8_4_ = auVar18._8_4_ * fVar163;
    auVar34._12_4_ = auVar18._12_4_ * fVar194;
    auVar34._16_4_ = auVar18._16_4_ * fVar195;
    auVar34._20_4_ = auVar18._20_4_ * fVar196;
    auVar34._24_4_ = auVar18._24_4_ * fVar197;
    auVar34._28_4_ = fStack_dc;
    auVar35._4_4_ = fVar217 * auVar17._4_4_;
    auVar35._0_4_ = fVar216 * auVar17._0_4_;
    auVar35._8_4_ = fVar218 * auVar17._8_4_;
    auVar35._12_4_ = fVar330 * auVar17._12_4_;
    auVar35._16_4_ = fVar339 * auVar17._16_4_;
    auVar35._20_4_ = fVar347 * auVar17._20_4_;
    auVar35._24_4_ = fVar348 * auVar17._24_4_;
    auVar35._28_4_ = auVar17._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar190._4_4_ * fVar162;
    auVar36._0_4_ = auVar190._0_4_ * fVar161;
    auVar36._8_4_ = auVar190._8_4_ * fVar163;
    auVar36._12_4_ = auVar190._12_4_ * fVar194;
    auVar36._16_4_ = auVar190._16_4_ * fVar195;
    auVar36._20_4_ = auVar190._20_4_ * fVar196;
    auVar36._24_4_ = auVar190._24_4_ * fVar197;
    auVar36._28_4_ = auVar23._28_4_ + auVar22._28_4_;
    auVar23._4_4_ = auVar104._4_4_ * fVar217;
    auVar23._0_4_ = auVar104._0_4_ * fVar216;
    auVar23._8_4_ = auVar104._8_4_ * fVar218;
    auVar23._12_4_ = auVar104._12_4_ * fVar330;
    auVar23._16_4_ = auVar104._16_4_ * fVar339;
    auVar23._20_4_ = auVar104._20_4_ * fVar347;
    auVar23._24_4_ = auVar104._24_4_ * fVar348;
    auVar23._28_4_ = fVar349 + auVar214._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar21 = vminps_avx(auVar19,auVar20);
    auVar101 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar24,auVar25);
    auVar101 = vmaxps_avx(auVar101,auVar21);
    auVar20 = vminps_avx(auVar26,auVar27);
    auVar21 = vmaxps_avx(auVar26,auVar27);
    auVar22 = vminps_avx(auVar28,auVar23);
    auVar20 = vminps_avx(auVar20,auVar22);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar28,auVar23);
    auVar21 = vmaxps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar101,auVar21);
    auVar101 = vcmpps_avx(auVar20,local_138,2);
    auVar21 = vcmpps_avx(auVar21,local_158,5);
    auVar101 = vandps_avx(auVar21,auVar101);
    auVar21 = local_228 & auVar101;
    uVar69 = 0;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(auVar103,local_78);
      auVar19 = vsubps_avx(auVar104,auVar266);
      fVar162 = auVar21._0_4_ + auVar19._0_4_;
      fVar163 = auVar21._4_4_ + auVar19._4_4_;
      fVar194 = auVar21._8_4_ + auVar19._8_4_;
      fVar195 = auVar21._12_4_ + auVar19._12_4_;
      fVar196 = auVar21._16_4_ + auVar19._16_4_;
      fVar197 = auVar21._20_4_ + auVar19._20_4_;
      fVar216 = auVar21._24_4_ + auVar19._24_4_;
      auVar20 = vsubps_avx(local_b8,local_98);
      auVar22 = vsubps_avx(auVar190,auVar284);
      fVar217 = auVar20._0_4_ + auVar22._0_4_;
      fVar218 = auVar20._4_4_ + auVar22._4_4_;
      fVar330 = auVar20._8_4_ + auVar22._8_4_;
      fVar339 = auVar20._12_4_ + auVar22._12_4_;
      fVar347 = auVar20._16_4_ + auVar22._16_4_;
      fVar348 = auVar20._20_4_ + auVar22._20_4_;
      fVar349 = auVar20._24_4_ + auVar22._24_4_;
      fVar161 = auVar22._28_4_;
      auVar37._4_4_ = local_98._4_4_ * fVar163;
      auVar37._0_4_ = local_98._0_4_ * fVar162;
      auVar37._8_4_ = local_98._8_4_ * fVar194;
      auVar37._12_4_ = local_98._12_4_ * fVar195;
      auVar37._16_4_ = local_98._16_4_ * fVar196;
      auVar37._20_4_ = local_98._20_4_ * fVar197;
      auVar37._24_4_ = local_98._24_4_ * fVar216;
      auVar37._28_4_ = local_98._28_4_;
      auVar38._4_4_ = local_78._4_4_ * fVar218;
      auVar38._0_4_ = local_78._0_4_ * fVar217;
      auVar38._8_4_ = local_78._8_4_ * fVar330;
      auVar38._12_4_ = local_78._12_4_ * fVar339;
      auVar38._16_4_ = local_78._16_4_ * fVar347;
      auVar38._20_4_ = local_78._20_4_ * fVar348;
      auVar38._24_4_ = local_78._24_4_ * fVar349;
      auVar38._28_4_ = local_78._28_4_;
      auVar22 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar371 * fVar163;
      auVar39._0_4_ = fVar363 * fVar162;
      auVar39._8_4_ = fVar373 * fVar194;
      auVar39._12_4_ = fVar375 * fVar195;
      auVar39._16_4_ = fVar364 * fVar196;
      auVar39._20_4_ = fVar372 * fVar197;
      auVar39._24_4_ = fVar374 * fVar216;
      auVar39._28_4_ = local_98._28_4_;
      auVar40._4_4_ = fVar218 * fStack_d4;
      auVar40._0_4_ = fVar217 * local_d8;
      auVar40._8_4_ = fVar330 * fStack_d0;
      auVar40._12_4_ = fVar339 * fStack_cc;
      auVar40._16_4_ = fVar347 * fStack_c8;
      auVar40._20_4_ = fVar348 * fStack_c4;
      auVar40._24_4_ = fVar349 * fStack_c0;
      auVar40._28_4_ = fVar161;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar163 * auVar102._4_4_;
      auVar41._0_4_ = fVar162 * auVar102._0_4_;
      auVar41._8_4_ = fVar194 * auVar102._8_4_;
      auVar41._12_4_ = fVar195 * auVar102._12_4_;
      auVar41._16_4_ = fVar196 * auVar102._16_4_;
      auVar41._20_4_ = fVar197 * auVar102._20_4_;
      auVar41._24_4_ = fVar216 * auVar102._24_4_;
      auVar41._28_4_ = fVar161;
      auVar42._4_4_ = fVar218 * fStack_4f4;
      auVar42._0_4_ = fVar217 * local_4f8;
      auVar42._8_4_ = fVar330 * fStack_4f0;
      auVar42._12_4_ = fVar339 * fStack_4ec;
      auVar42._16_4_ = fVar347 * fStack_4e8;
      auVar42._20_4_ = fVar348 * fStack_4e4;
      auVar42._24_4_ = fVar349 * fStack_4e0;
      auVar42._28_4_ = local_98._28_4_ + auVar213._28_4_;
      auVar102 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_b8._4_4_ * fVar163;
      auVar43._0_4_ = local_b8._0_4_ * fVar162;
      auVar43._8_4_ = local_b8._8_4_ * fVar194;
      auVar43._12_4_ = local_b8._12_4_ * fVar195;
      auVar43._16_4_ = local_b8._16_4_ * fVar196;
      auVar43._20_4_ = local_b8._20_4_ * fVar197;
      auVar43._24_4_ = local_b8._24_4_ * fVar216;
      auVar43._28_4_ = local_98._28_4_ + auVar213._28_4_;
      auVar44._4_4_ = auVar103._4_4_ * fVar218;
      auVar44._0_4_ = auVar103._0_4_ * fVar217;
      auVar44._8_4_ = auVar103._8_4_ * fVar330;
      auVar44._12_4_ = auVar103._12_4_ * fVar339;
      auVar44._16_4_ = auVar103._16_4_ * fVar347;
      auVar44._20_4_ = auVar103._20_4_ * fVar348;
      uVar4 = auVar103._28_4_;
      auVar44._24_4_ = auVar103._24_4_ * fVar349;
      auVar44._28_4_ = uVar4;
      auVar103 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar284._4_4_ * fVar163;
      auVar45._0_4_ = auVar284._0_4_ * fVar162;
      auVar45._8_4_ = auVar284._8_4_ * fVar194;
      auVar45._12_4_ = auVar284._12_4_ * fVar195;
      auVar45._16_4_ = auVar284._16_4_ * fVar196;
      auVar45._20_4_ = auVar284._20_4_ * fVar197;
      auVar45._24_4_ = auVar284._24_4_ * fVar216;
      auVar45._28_4_ = auVar284._28_4_;
      auVar46._4_4_ = auVar266._4_4_ * fVar218;
      auVar46._0_4_ = auVar266._0_4_ * fVar217;
      auVar46._8_4_ = auVar266._8_4_ * fVar330;
      auVar46._12_4_ = auVar266._12_4_ * fVar339;
      auVar46._16_4_ = auVar266._16_4_ * fVar347;
      auVar46._20_4_ = auVar266._20_4_ * fVar348;
      auVar46._24_4_ = auVar266._24_4_ * fVar349;
      auVar46._28_4_ = auVar266._28_4_;
      auVar214 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar163 * fStack_114;
      auVar47._0_4_ = fVar162 * local_118;
      auVar47._8_4_ = fVar194 * fStack_110;
      auVar47._12_4_ = fVar195 * fStack_10c;
      auVar47._16_4_ = fVar196 * fStack_108;
      auVar47._20_4_ = fVar197 * fStack_104;
      auVar47._24_4_ = fVar216 * fStack_100;
      auVar47._28_4_ = auVar284._28_4_;
      auVar48._4_4_ = fVar218 * fStack_f4;
      auVar48._0_4_ = fVar217 * local_f8;
      auVar48._8_4_ = fVar330 * fStack_f0;
      auVar48._12_4_ = fVar339 * fStack_ec;
      auVar48._16_4_ = fVar347 * fStack_e8;
      auVar48._20_4_ = fVar348 * fStack_e4;
      auVar48._24_4_ = fVar349 * fStack_e0;
      auVar48._28_4_ = uVar4;
      auVar24 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar163 * auVar18._4_4_;
      auVar49._0_4_ = fVar162 * auVar18._0_4_;
      auVar49._8_4_ = fVar194 * auVar18._8_4_;
      auVar49._12_4_ = fVar195 * auVar18._12_4_;
      auVar49._16_4_ = fVar196 * auVar18._16_4_;
      auVar49._20_4_ = fVar197 * auVar18._20_4_;
      auVar49._24_4_ = fVar216 * auVar18._24_4_;
      auVar49._28_4_ = uVar4;
      auVar50._4_4_ = fVar218 * auVar17._4_4_;
      auVar50._0_4_ = fVar217 * auVar17._0_4_;
      auVar50._8_4_ = fVar330 * auVar17._8_4_;
      auVar50._12_4_ = fVar339 * auVar17._12_4_;
      auVar50._16_4_ = fVar347 * auVar17._16_4_;
      auVar50._20_4_ = fVar348 * auVar17._20_4_;
      auVar50._24_4_ = fVar349 * auVar17._24_4_;
      auVar50._28_4_ = local_b8._28_4_;
      auVar17 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar190._4_4_ * fVar163;
      auVar51._0_4_ = auVar190._0_4_ * fVar162;
      auVar51._8_4_ = auVar190._8_4_ * fVar194;
      auVar51._12_4_ = auVar190._12_4_ * fVar195;
      auVar51._16_4_ = auVar190._16_4_ * fVar196;
      auVar51._20_4_ = auVar190._20_4_ * fVar197;
      auVar51._24_4_ = auVar190._24_4_ * fVar216;
      auVar51._28_4_ = auVar21._28_4_ + auVar19._28_4_;
      auVar52._4_4_ = auVar104._4_4_ * fVar218;
      auVar52._0_4_ = auVar104._0_4_ * fVar217;
      auVar52._8_4_ = auVar104._8_4_ * fVar330;
      auVar52._12_4_ = auVar104._12_4_ * fVar339;
      auVar52._16_4_ = auVar104._16_4_ * fVar347;
      auVar52._20_4_ = auVar104._20_4_ * fVar348;
      auVar52._24_4_ = auVar104._24_4_ * fVar349;
      auVar52._28_4_ = auVar20._28_4_ + fVar161;
      auVar104 = vsubps_avx(auVar51,auVar52);
      auVar19 = vminps_avx(auVar22,auVar23);
      auVar21 = vmaxps_avx(auVar22,auVar23);
      auVar20 = vminps_avx(auVar102,auVar103);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar102,auVar103);
      auVar21 = vmaxps_avx(auVar21,auVar19);
      auVar22 = vminps_avx(auVar214,auVar24);
      auVar19 = vmaxps_avx(auVar214,auVar24);
      auVar102 = vminps_avx(auVar17,auVar104);
      auVar22 = vminps_avx(auVar22,auVar102);
      auVar22 = vminps_avx(auVar20,auVar22);
      auVar20 = vmaxps_avx(auVar17,auVar104);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar21,auVar19);
      auVar21 = vcmpps_avx(auVar22,local_138,2);
      auVar19 = vcmpps_avx(auVar19,local_158,5);
      auVar21 = vandps_avx(auVar19,auVar21);
      auVar101 = vandps_avx(auVar101,local_228);
      auVar19 = auVar101 & auVar21;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar21,auVar101);
        uVar69 = vmovmskps_avx(auVar101);
      }
    }
    if (uVar69 != 0) {
      auStack_398[uVar72] = uVar69;
      uVar5 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar72 * 2) = uVar5;
      uVar77 = vmovlps_avx(local_5b8);
      auStack_58[uVar72] = uVar77;
      uVar72 = (ulong)((int)uVar72 + 1);
    }
    auVar370 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar72 == 0) {
        if (bVar67) {
          return local_5f9;
        }
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar100._4_4_ = uVar4;
        auVar100._0_4_ = uVar4;
        auVar100._8_4_ = uVar4;
        auVar100._12_4_ = uVar4;
        auVar123 = vcmpps_avx(local_2f8,auVar100,2);
        uVar71 = vmovmskps_avx(auVar123);
        uVar68 = uVar68 & uVar68 + 0xf & uVar71;
        local_5f9 = uVar68 != 0;
        if (!local_5f9) {
          return local_5f9;
        }
        goto LAB_0105ef58;
      }
      uVar74 = (int)uVar72 - 1;
      uVar75 = (ulong)uVar74;
      uVar69 = auStack_398[uVar75];
      fVar161 = afStack_208[uVar75 * 2];
      fVar162 = afStack_208[uVar75 * 2 + 1];
      local_5b8._8_8_ = 0;
      local_5b8._0_8_ = auStack_58[uVar75];
      uVar77 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_398[uVar75] = uVar69;
      if (uVar69 == 0) {
        uVar72 = (ulong)uVar74;
      }
      auVar228._8_4_ = 0x3f800000;
      auVar228._0_8_ = &DAT_3f8000003f800000;
      auVar228._12_4_ = 0x3f800000;
      fVar194 = (float)(uVar77 + 1) * 0.14285715;
      fVar163 = (1.0 - (float)uVar77 * 0.14285715) * fVar161 + fVar162 * (float)uVar77 * 0.14285715;
      fVar161 = (1.0 - fVar194) * fVar161 + fVar162 * fVar194;
      fVar162 = fVar161 - fVar163;
      if (0.16666667 <= fVar162) break;
      auVar123 = vshufps_avx(local_5b8,local_5b8,0x50);
      auVar89 = vsubps_avx(auVar228,auVar123);
      fVar194 = auVar123._0_4_;
      fVar195 = auVar123._4_4_;
      fVar196 = auVar123._8_4_;
      fVar197 = auVar123._12_4_;
      fVar216 = auVar89._0_4_;
      fVar217 = auVar89._4_4_;
      fVar218 = auVar89._8_4_;
      fVar330 = auVar89._12_4_;
      auVar179._0_4_ = auVar274._0_4_ * fVar194 + fVar216 * (float)local_4d8._0_4_;
      auVar179._4_4_ = auVar274._4_4_ * fVar195 + fVar217 * (float)local_4d8._4_4_;
      auVar179._8_4_ = auVar274._0_4_ * fVar196 + fVar218 * (float)local_4d8._0_4_;
      auVar179._12_4_ = auVar274._4_4_ * fVar197 + fVar330 * (float)local_4d8._4_4_;
      auVar206._0_4_ = auVar287._0_4_ * fVar194 + fVar216 * (float)local_3a8._0_4_;
      auVar206._4_4_ = auVar287._4_4_ * fVar195 + fVar217 * (float)local_3a8._4_4_;
      auVar206._8_4_ = auVar287._0_4_ * fVar196 + fVar218 * fStack_3a0;
      auVar206._12_4_ = auVar287._4_4_ * fVar197 + fVar330 * fStack_39c;
      auVar229._0_4_ = auVar300._0_4_ * fVar194 + fVar216 * auVar354._0_4_;
      auVar229._4_4_ = auVar300._4_4_ * fVar195 + fVar217 * auVar354._4_4_;
      auVar229._8_4_ = auVar300._0_4_ * fVar196 + fVar218 * auVar354._0_4_;
      auVar229._12_4_ = auVar300._4_4_ * fVar197 + fVar330 * auVar354._4_4_;
      auVar119._0_4_ = auVar96._0_4_ * fVar194 + auVar117._0_4_ * fVar216;
      auVar119._4_4_ = auVar96._4_4_ * fVar195 + auVar117._4_4_ * fVar217;
      auVar119._8_4_ = auVar96._0_4_ * fVar196 + auVar117._0_4_ * fVar218;
      auVar119._12_4_ = auVar96._4_4_ * fVar197 + auVar117._4_4_ * fVar330;
      auVar157._16_16_ = auVar179;
      auVar157._0_16_ = auVar179;
      auVar191._16_16_ = auVar206;
      auVar191._0_16_ = auVar206;
      auVar215._16_16_ = auVar229;
      auVar215._0_16_ = auVar229;
      auVar101 = vshufps_avx(ZEXT2032(CONCAT416(fVar161,ZEXT416((uint)fVar163))),
                             ZEXT2032(CONCAT416(fVar161,ZEXT416((uint)fVar163))),0);
      auVar21 = vsubps_avx(auVar191,auVar157);
      fVar194 = auVar101._0_4_;
      fVar195 = auVar101._4_4_;
      fVar196 = auVar101._8_4_;
      fVar197 = auVar101._12_4_;
      fVar216 = auVar101._16_4_;
      fVar217 = auVar101._20_4_;
      fVar218 = auVar101._24_4_;
      auVar158._0_4_ = auVar179._0_4_ + auVar21._0_4_ * fVar194;
      auVar158._4_4_ = auVar179._4_4_ + auVar21._4_4_ * fVar195;
      auVar158._8_4_ = auVar179._8_4_ + auVar21._8_4_ * fVar196;
      auVar158._12_4_ = auVar179._12_4_ + auVar21._12_4_ * fVar197;
      auVar158._16_4_ = auVar179._0_4_ + auVar21._16_4_ * fVar216;
      auVar158._20_4_ = auVar179._4_4_ + auVar21._20_4_ * fVar217;
      auVar158._24_4_ = auVar179._8_4_ + auVar21._24_4_ * fVar218;
      auVar158._28_4_ = auVar179._12_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar215,auVar191);
      auVar192._0_4_ = auVar206._0_4_ + auVar21._0_4_ * fVar194;
      auVar192._4_4_ = auVar206._4_4_ + auVar21._4_4_ * fVar195;
      auVar192._8_4_ = auVar206._8_4_ + auVar21._8_4_ * fVar196;
      auVar192._12_4_ = auVar206._12_4_ + auVar21._12_4_ * fVar197;
      auVar192._16_4_ = auVar206._0_4_ + auVar21._16_4_ * fVar216;
      auVar192._20_4_ = auVar206._4_4_ + auVar21._20_4_ * fVar217;
      auVar192._24_4_ = auVar206._8_4_ + auVar21._24_4_ * fVar218;
      auVar192._28_4_ = auVar206._12_4_ + auVar21._28_4_;
      auVar123 = vsubps_avx(auVar119,auVar229);
      auVar132._0_4_ = auVar229._0_4_ + auVar123._0_4_ * fVar194;
      auVar132._4_4_ = auVar229._4_4_ + auVar123._4_4_ * fVar195;
      auVar132._8_4_ = auVar229._8_4_ + auVar123._8_4_ * fVar196;
      auVar132._12_4_ = auVar229._12_4_ + auVar123._12_4_ * fVar197;
      auVar132._16_4_ = auVar229._0_4_ + auVar123._0_4_ * fVar216;
      auVar132._20_4_ = auVar229._4_4_ + auVar123._4_4_ * fVar217;
      auVar132._24_4_ = auVar229._8_4_ + auVar123._8_4_ * fVar218;
      auVar132._28_4_ = auVar229._12_4_ + auVar123._12_4_;
      auVar21 = vsubps_avx(auVar192,auVar158);
      auVar159._0_4_ = auVar158._0_4_ + fVar194 * auVar21._0_4_;
      auVar159._4_4_ = auVar158._4_4_ + fVar195 * auVar21._4_4_;
      auVar159._8_4_ = auVar158._8_4_ + fVar196 * auVar21._8_4_;
      auVar159._12_4_ = auVar158._12_4_ + fVar197 * auVar21._12_4_;
      auVar159._16_4_ = auVar158._16_4_ + fVar216 * auVar21._16_4_;
      auVar159._20_4_ = auVar158._20_4_ + fVar217 * auVar21._20_4_;
      auVar159._24_4_ = auVar158._24_4_ + fVar218 * auVar21._24_4_;
      auVar159._28_4_ = auVar158._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar132,auVar192);
      auVar133._0_4_ = auVar192._0_4_ + fVar194 * auVar21._0_4_;
      auVar133._4_4_ = auVar192._4_4_ + fVar195 * auVar21._4_4_;
      auVar133._8_4_ = auVar192._8_4_ + fVar196 * auVar21._8_4_;
      auVar133._12_4_ = auVar192._12_4_ + fVar197 * auVar21._12_4_;
      auVar133._16_4_ = auVar192._16_4_ + fVar216 * auVar21._16_4_;
      auVar133._20_4_ = auVar192._20_4_ + fVar217 * auVar21._20_4_;
      auVar133._24_4_ = auVar192._24_4_ + fVar218 * auVar21._24_4_;
      auVar133._28_4_ = auVar192._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar133,auVar159);
      auVar180._0_4_ = auVar159._0_4_ + fVar194 * auVar21._0_4_;
      auVar180._4_4_ = auVar159._4_4_ + fVar195 * auVar21._4_4_;
      auVar180._8_4_ = auVar159._8_4_ + fVar196 * auVar21._8_4_;
      auVar180._12_4_ = auVar159._12_4_ + fVar197 * auVar21._12_4_;
      auVar193._16_4_ = auVar159._16_4_ + fVar216 * auVar21._16_4_;
      auVar193._0_16_ = auVar180;
      auVar193._20_4_ = auVar159._20_4_ + fVar217 * auVar21._20_4_;
      auVar193._24_4_ = auVar159._24_4_ + fVar218 * auVar21._24_4_;
      auVar193._28_4_ = auVar159._28_4_ + auVar192._28_4_;
      fVar194 = auVar21._4_4_ * 3.0;
      auVar149 = auVar193._16_16_;
      auVar122 = vshufps_avx(ZEXT416((uint)(fVar162 * 0.33333334)),
                             ZEXT416((uint)(fVar162 * 0.33333334)),0);
      auVar288._0_4_ = auVar180._0_4_ + auVar122._0_4_ * auVar21._0_4_ * 3.0;
      auVar288._4_4_ = auVar180._4_4_ + auVar122._4_4_ * fVar194;
      auVar288._8_4_ = auVar180._8_4_ + auVar122._8_4_ * auVar21._8_4_ * 3.0;
      auVar288._12_4_ = auVar180._12_4_ + auVar122._12_4_ * auVar21._12_4_ * 3.0;
      auVar176 = vshufpd_avx(auVar180,auVar180,3);
      auVar186 = vshufpd_avx(auVar149,auVar149,3);
      auVar123 = vsubps_avx(auVar176,auVar180);
      auVar89 = vsubps_avx(auVar186,auVar149);
      auVar120._0_4_ = auVar123._0_4_ + auVar89._0_4_;
      auVar120._4_4_ = auVar123._4_4_ + auVar89._4_4_;
      auVar120._8_4_ = auVar123._8_4_ + auVar89._8_4_;
      auVar120._12_4_ = auVar123._12_4_ + auVar89._12_4_;
      auVar123 = vmovshdup_avx(auVar180);
      auVar89 = vmovshdup_avx(auVar288);
      auVar185 = vshufps_avx(auVar120,auVar120,0);
      auVar98 = vshufps_avx(auVar120,auVar120,0x55);
      fVar217 = auVar98._0_4_;
      fVar218 = auVar98._4_4_;
      fVar330 = auVar98._8_4_;
      fVar339 = auVar98._12_4_;
      fVar195 = auVar185._0_4_;
      fVar196 = auVar185._4_4_;
      fVar197 = auVar185._8_4_;
      fVar216 = auVar185._12_4_;
      auVar275._0_4_ = fVar195 * auVar180._0_4_ + fVar217 * auVar123._0_4_;
      auVar275._4_4_ = fVar196 * auVar180._4_4_ + fVar218 * auVar123._4_4_;
      auVar275._8_4_ = fVar197 * auVar180._8_4_ + fVar330 * auVar123._8_4_;
      auVar275._12_4_ = fVar216 * auVar180._12_4_ + fVar339 * auVar123._12_4_;
      auVar289._0_4_ = auVar288._0_4_ * fVar195 + fVar217 * auVar89._0_4_;
      auVar289._4_4_ = auVar288._4_4_ * fVar196 + fVar218 * auVar89._4_4_;
      auVar289._8_4_ = auVar288._8_4_ * fVar197 + fVar330 * auVar89._8_4_;
      auVar289._12_4_ = auVar288._12_4_ * fVar216 + fVar339 * auVar89._12_4_;
      auVar89 = vshufps_avx(auVar275,auVar275,0xe8);
      auVar185 = vshufps_avx(auVar289,auVar289,0xe8);
      auVar123 = vcmpps_avx(auVar89,auVar185,1);
      uVar69 = vextractps_avx(auVar123,0);
      auVar98 = auVar289;
      if ((uVar69 & 1) == 0) {
        auVar98 = auVar275;
      }
      auVar121._0_4_ = auVar122._0_4_ * auVar21._16_4_ * 3.0;
      auVar121._4_4_ = auVar122._4_4_ * fVar194;
      auVar121._8_4_ = auVar122._8_4_ * auVar21._24_4_ * 3.0;
      auVar121._12_4_ = auVar122._12_4_ * auVar101._28_4_;
      auVar79 = vsubps_avx(auVar149,auVar121);
      auVar122 = vmovshdup_avx(auVar79);
      auVar149 = vmovshdup_avx(auVar149);
      fVar194 = auVar79._0_4_;
      fVar347 = auVar79._4_4_;
      auVar367._0_4_ = fVar195 * fVar194 + fVar217 * auVar122._0_4_;
      auVar367._4_4_ = fVar196 * fVar347 + fVar218 * auVar122._4_4_;
      auVar367._8_4_ = fVar197 * auVar79._8_4_ + fVar330 * auVar122._8_4_;
      auVar367._12_4_ = fVar216 * auVar79._12_4_ + fVar339 * auVar122._12_4_;
      auVar343._0_4_ = fVar195 * auVar193._16_4_ + fVar217 * auVar149._0_4_;
      auVar343._4_4_ = fVar196 * auVar193._20_4_ + fVar218 * auVar149._4_4_;
      auVar343._8_4_ = fVar197 * auVar193._24_4_ + fVar330 * auVar149._8_4_;
      auVar343._12_4_ = fVar216 * auVar193._28_4_ + fVar339 * auVar149._12_4_;
      auVar149 = vshufps_avx(auVar367,auVar367,0xe8);
      auVar16 = vshufps_avx(auVar343,auVar343,0xe8);
      auVar122 = vcmpps_avx(auVar149,auVar16,1);
      uVar69 = vextractps_avx(auVar122,0);
      auVar80 = auVar343;
      if ((uVar69 & 1) == 0) {
        auVar80 = auVar367;
      }
      auVar98 = vmaxss_avx(auVar80,auVar98);
      auVar89 = vminps_avx(auVar89,auVar185);
      auVar185 = vminps_avx(auVar149,auVar16);
      auVar185 = vminps_avx(auVar89,auVar185);
      auVar123 = vshufps_avx(auVar123,auVar123,0x55);
      auVar123 = vblendps_avx(auVar123,auVar122,2);
      auVar122 = vpslld_avx(auVar123,0x1f);
      auVar123 = vshufpd_avx(auVar289,auVar289,1);
      auVar123 = vinsertps_avx(auVar123,auVar343,0x9c);
      auVar89 = vshufpd_avx(auVar275,auVar275,1);
      auVar89 = vinsertps_avx(auVar89,auVar367,0x9c);
      auVar123 = vblendvps_avx(auVar89,auVar123,auVar122);
      auVar89 = vmovshdup_avx(auVar123);
      auVar123 = vmaxss_avx(auVar89,auVar123);
      fVar197 = auVar185._0_4_;
      auVar89 = vmovshdup_avx(auVar185);
      fVar196 = auVar123._0_4_;
      fVar216 = auVar89._0_4_;
      fVar195 = auVar98._0_4_;
      if ((0.0001 <= fVar197) || (fVar196 <= -0.0001)) {
        if ((-0.0001 < fVar195 && fVar216 < 0.0001) ||
           ((fVar197 < 0.0001 && -0.0001 < fVar195 || (fVar216 < 0.0001 && -0.0001 < fVar196))))
        goto LAB_0106062b;
LAB_01061263:
        bVar53 = true;
        auVar370 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0106062b:
        auVar370 = ZEXT464(0) << 0x20;
        auVar122 = vcmpps_avx(auVar185,ZEXT416(0) << 0x20,1);
        auVar89 = vcmpss_avx(auVar98,ZEXT416(0),1);
        auVar355._8_4_ = 0x3f800000;
        auVar355._0_8_ = &DAT_3f8000003f800000;
        auVar355._12_4_ = 0x3f800000;
        auVar230._8_4_ = 0xbf800000;
        auVar230._0_8_ = 0xbf800000bf800000;
        auVar230._12_4_ = 0xbf800000;
        auVar89 = vblendvps_avx(auVar355,auVar230,auVar89);
        auVar122 = vblendvps_avx(auVar355,auVar230,auVar122);
        auVar149 = vcmpss_avx(auVar89,auVar122,4);
        auVar149 = vpshufd_avx(ZEXT416(auVar149._0_4_ & 1),0x50);
        auVar149 = vpslld_avx(auVar149,0x1f);
        auVar149 = vpsrad_avx(auVar149,0x1f);
        auVar149 = vpandn_avx(auVar149,_DAT_02020eb0);
        auVar16 = vmovshdup_avx(auVar122);
        fVar217 = auVar16._0_4_;
        if ((auVar122._0_4_ != fVar217) || (NAN(auVar122._0_4_) || NAN(fVar217))) {
          if ((fVar216 != fVar197) || (NAN(fVar216) || NAN(fVar197))) {
            fVar197 = -fVar197 / (fVar216 - fVar197);
            auVar122 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar197) * 0.0 + fVar197)));
          }
          else {
            auVar122 = vcmpss_avx(auVar185,ZEXT416(0),0);
            auVar122 = vpshufd_avx(ZEXT416(auVar122._0_4_ & 1),0x50);
            auVar122 = vpslld_avx(auVar122,0x1f);
            auVar122 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar122);
          }
          auVar16 = vcmpps_avx(auVar149,auVar122,1);
          auVar185 = vblendps_avx(auVar149,auVar122,2);
          auVar122 = vblendps_avx(auVar122,auVar149,2);
          auVar149 = vblendvps_avx(auVar122,auVar185,auVar16);
        }
        auVar123 = vcmpss_avx(auVar123,ZEXT416(0),1);
        auVar150._8_4_ = 0xbf800000;
        auVar150._0_8_ = 0xbf800000bf800000;
        auVar150._12_4_ = 0xbf800000;
        auVar123 = vblendvps_avx(auVar355,auVar150,auVar123);
        fVar197 = auVar123._0_4_;
        if ((auVar89._0_4_ != fVar197) || (NAN(auVar89._0_4_) || NAN(fVar197))) {
          if ((fVar196 != fVar195) || (NAN(fVar196) || NAN(fVar195))) {
            fVar195 = -fVar195 / (fVar196 - fVar195);
            auVar123 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar195) * 0.0 + fVar195)));
          }
          else {
            auVar123 = vcmpss_avx(auVar98,ZEXT416(0),0);
            auVar123 = vpshufd_avx(ZEXT416(auVar123._0_4_ & 1),0x50);
            auVar123 = vpslld_avx(auVar123,0x1f);
            auVar123 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar123);
          }
          auVar122 = vcmpps_avx(auVar149,auVar123,1);
          auVar89 = vblendps_avx(auVar149,auVar123,2);
          auVar123 = vblendps_avx(auVar123,auVar149,2);
          auVar149 = vblendvps_avx(auVar123,auVar89,auVar122);
        }
        if ((fVar217 != fVar197) || (NAN(fVar217) || NAN(fVar197))) {
          auVar123 = vcmpps_avx(auVar149,auVar355,1);
          auVar89 = vinsertps_avx(auVar149,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar231._4_12_ = auVar149._4_12_;
          auVar231._0_4_ = 0x3f800000;
          auVar149 = vblendvps_avx(auVar231,auVar89,auVar123);
        }
        auVar123 = vcmpps_avx(auVar149,_DAT_01fec6f0,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar149._4_12_;
        auVar89 = vinsertps_avx(auVar149,ZEXT416(0x3f800000),0x10);
        auVar123 = vblendvps_avx(auVar89,auVar54 << 0x20,auVar123);
        auVar89 = vmovshdup_avx(auVar123);
        bVar53 = true;
        if (auVar123._0_4_ <= auVar89._0_4_) {
          auVar124._0_4_ = auVar123._0_4_ + -0.1;
          auVar124._4_4_ = auVar123._4_4_ + 0.1;
          auVar124._8_4_ = auVar123._8_4_ + 0.0;
          auVar124._12_4_ = auVar123._12_4_ + 0.0;
          auVar122 = vshufpd_avx(auVar288,auVar288,3);
          auVar181._8_8_ = 0x3f80000000000000;
          auVar181._0_8_ = 0x3f80000000000000;
          auVar123 = vcmpps_avx(auVar124,auVar181,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar124._4_12_;
          auVar89 = vinsertps_avx(auVar124,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar123 = vblendvps_avx(auVar89,auVar55 << 0x20,auVar123);
          auVar89 = vshufpd_avx(auVar79,auVar79,3);
          auVar185 = vshufps_avx(auVar123,auVar123,0x50);
          auVar98 = vsubps_avx(auVar355,auVar185);
          local_438 = auVar176._0_4_;
          fStack_434 = auVar176._4_4_;
          fStack_430 = auVar176._8_4_;
          fStack_42c = auVar176._12_4_;
          fVar195 = auVar185._0_4_;
          fVar196 = auVar185._4_4_;
          fVar197 = auVar185._8_4_;
          fVar216 = auVar185._12_4_;
          local_568 = auVar186._0_4_;
          fStack_564 = auVar186._4_4_;
          fStack_560 = auVar186._8_4_;
          fStack_55c = auVar186._12_4_;
          fVar217 = auVar98._0_4_;
          fVar218 = auVar98._4_4_;
          fVar330 = auVar98._8_4_;
          fVar339 = auVar98._12_4_;
          auVar151._0_4_ = fVar195 * local_438 + fVar217 * auVar180._0_4_;
          auVar151._4_4_ = fVar196 * fStack_434 + fVar218 * auVar180._4_4_;
          auVar151._8_4_ = fVar197 * fStack_430 + fVar330 * auVar180._0_4_;
          auVar151._12_4_ = fVar216 * fStack_42c + fVar339 * auVar180._4_4_;
          auVar207._0_4_ = fVar195 * auVar122._0_4_ + fVar217 * auVar288._0_4_;
          auVar207._4_4_ = fVar196 * auVar122._4_4_ + fVar218 * auVar288._4_4_;
          auVar207._8_4_ = fVar197 * auVar122._8_4_ + fVar330 * auVar288._0_4_;
          auVar207._12_4_ = fVar216 * auVar122._12_4_ + fVar339 * auVar288._4_4_;
          auVar264._0_4_ = fVar195 * auVar89._0_4_ + fVar217 * fVar194;
          auVar264._4_4_ = fVar196 * auVar89._4_4_ + fVar218 * fVar347;
          auVar264._8_4_ = fVar197 * auVar89._8_4_ + fVar330 * fVar194;
          auVar264._12_4_ = fVar216 * auVar89._12_4_ + fVar339 * fVar347;
          auVar276._0_4_ = fVar195 * local_568 + fVar217 * auVar193._16_4_;
          auVar276._4_4_ = fVar196 * fStack_564 + fVar218 * auVar193._20_4_;
          auVar276._8_4_ = fVar197 * fStack_560 + fVar330 * auVar193._16_4_;
          auVar276._12_4_ = fVar216 * fStack_55c + fVar339 * auVar193._20_4_;
          auVar186 = vsubps_avx(auVar355,auVar123);
          auVar89 = vmovshdup_avx(local_5b8);
          auVar176 = vmovsldup_avx(local_5b8);
          local_5b8._0_4_ = auVar186._0_4_ * auVar176._0_4_ + auVar89._0_4_ * auVar123._0_4_;
          local_5b8._4_4_ = auVar186._4_4_ * auVar176._4_4_ + auVar89._4_4_ * auVar123._4_4_;
          local_5b8._8_4_ = auVar186._8_4_ * auVar176._8_4_ + auVar89._8_4_ * auVar123._8_4_;
          local_5b8._12_4_ = auVar186._12_4_ * auVar176._12_4_ + auVar89._12_4_ * auVar123._12_4_;
          auVar79 = vmovshdup_avx(local_5b8);
          auVar123 = vsubps_avx(auVar207,auVar151);
          auVar232._0_4_ = auVar123._0_4_ * 3.0;
          auVar232._4_4_ = auVar123._4_4_ * 3.0;
          auVar232._8_4_ = auVar123._8_4_ * 3.0;
          auVar232._12_4_ = auVar123._12_4_ * 3.0;
          auVar123 = vsubps_avx(auVar264,auVar207);
          auVar248._0_4_ = auVar123._0_4_ * 3.0;
          auVar248._4_4_ = auVar123._4_4_ * 3.0;
          auVar248._8_4_ = auVar123._8_4_ * 3.0;
          auVar248._12_4_ = auVar123._12_4_ * 3.0;
          auVar123 = vsubps_avx(auVar276,auVar264);
          auVar290._0_4_ = auVar123._0_4_ * 3.0;
          auVar290._4_4_ = auVar123._4_4_ * 3.0;
          auVar290._8_4_ = auVar123._8_4_ * 3.0;
          auVar290._12_4_ = auVar123._12_4_ * 3.0;
          auVar89 = vminps_avx(auVar248,auVar290);
          auVar123 = vmaxps_avx(auVar248,auVar290);
          auVar89 = vminps_avx(auVar232,auVar89);
          auVar123 = vmaxps_avx(auVar232,auVar123);
          auVar176 = vshufpd_avx(auVar89,auVar89,3);
          auVar186 = vshufpd_avx(auVar123,auVar123,3);
          auVar89 = vminps_avx(auVar89,auVar176);
          auVar123 = vmaxps_avx(auVar123,auVar186);
          auVar176 = vshufps_avx(ZEXT416((uint)(1.0 / fVar162)),ZEXT416((uint)(1.0 / fVar162)),0);
          auVar233._0_4_ = auVar176._0_4_ * auVar89._0_4_;
          auVar233._4_4_ = auVar176._4_4_ * auVar89._4_4_;
          auVar233._8_4_ = auVar176._8_4_ * auVar89._8_4_;
          auVar233._12_4_ = auVar176._12_4_ * auVar89._12_4_;
          auVar249._0_4_ = auVar123._0_4_ * auVar176._0_4_;
          auVar249._4_4_ = auVar123._4_4_ * auVar176._4_4_;
          auVar249._8_4_ = auVar123._8_4_ * auVar176._8_4_;
          auVar249._12_4_ = auVar123._12_4_ * auVar176._12_4_;
          auVar98 = ZEXT416((uint)(1.0 / (auVar79._0_4_ - local_5b8._0_4_)));
          auVar123 = vshufpd_avx(auVar151,auVar151,3);
          auVar89 = vshufpd_avx(auVar207,auVar207,3);
          auVar176 = vshufpd_avx(auVar264,auVar264,3);
          auVar186 = vshufpd_avx(auVar276,auVar276,3);
          auVar123 = vsubps_avx(auVar123,auVar151);
          auVar122 = vsubps_avx(auVar89,auVar207);
          auVar185 = vsubps_avx(auVar176,auVar264);
          auVar186 = vsubps_avx(auVar186,auVar276);
          auVar89 = vminps_avx(auVar123,auVar122);
          auVar123 = vmaxps_avx(auVar123,auVar122);
          auVar176 = vminps_avx(auVar185,auVar186);
          auVar176 = vminps_avx(auVar89,auVar176);
          auVar89 = vmaxps_avx(auVar185,auVar186);
          auVar123 = vmaxps_avx(auVar123,auVar89);
          auVar89 = vshufps_avx(auVar98,auVar98,0);
          auVar301._0_4_ = auVar89._0_4_ * auVar176._0_4_;
          auVar301._4_4_ = auVar89._4_4_ * auVar176._4_4_;
          auVar301._8_4_ = auVar89._8_4_ * auVar176._8_4_;
          auVar301._12_4_ = auVar89._12_4_ * auVar176._12_4_;
          auVar312._0_4_ = auVar89._0_4_ * auVar123._0_4_;
          auVar312._4_4_ = auVar89._4_4_ * auVar123._4_4_;
          auVar312._8_4_ = auVar89._8_4_ * auVar123._8_4_;
          auVar312._12_4_ = auVar89._12_4_ * auVar123._12_4_;
          auVar123 = vmovsldup_avx(local_5b8);
          auVar265._4_12_ = auVar123._4_12_;
          auVar265._0_4_ = fVar163;
          auVar277._4_12_ = local_5b8._4_12_;
          auVar277._0_4_ = fVar161;
          auVar99._0_4_ = (fVar161 + fVar163) * 0.5;
          auVar99._4_4_ = (local_5b8._4_4_ + auVar123._4_4_) * 0.5;
          auVar99._8_4_ = (local_5b8._8_4_ + auVar123._8_4_) * 0.5;
          auVar99._12_4_ = (local_5b8._12_4_ + auVar123._12_4_) * 0.5;
          auVar123 = vshufps_avx(auVar99,auVar99,0);
          fVar194 = auVar123._0_4_;
          fVar195 = auVar123._4_4_;
          fVar196 = auVar123._8_4_;
          fVar197 = auVar123._12_4_;
          local_508 = auVar14._0_4_;
          fStack_504 = auVar14._4_4_;
          fStack_500 = auVar14._8_4_;
          fStack_4fc = auVar14._12_4_;
          auVar208._0_4_ = fVar194 * (float)local_238._0_4_ + local_508;
          auVar208._4_4_ = fVar195 * (float)local_238._4_4_ + fStack_504;
          auVar208._8_4_ = fVar196 * fStack_230 + fStack_500;
          auVar208._12_4_ = fVar197 * fStack_22c + fStack_4fc;
          local_518._0_4_ = auVar15._0_4_;
          local_518._4_4_ = auVar15._4_4_;
          fStack_510 = auVar15._8_4_;
          fStack_50c = auVar15._12_4_;
          auVar291._0_4_ = fVar194 * (float)local_248._0_4_ + (float)local_518._0_4_;
          auVar291._4_4_ = fVar195 * (float)local_248._4_4_ + (float)local_518._4_4_;
          auVar291._8_4_ = fVar196 * fStack_240 + fStack_510;
          auVar291._12_4_ = fVar197 * fStack_23c + fStack_50c;
          local_528 = auVar113._0_4_;
          fStack_524 = auVar113._4_4_;
          fStack_520 = auVar113._8_4_;
          fStack_51c = auVar113._12_4_;
          auVar325._0_4_ = fVar194 * (float)local_258._0_4_ + local_528;
          auVar325._4_4_ = fVar195 * (float)local_258._4_4_ + fStack_524;
          auVar325._8_4_ = fVar196 * fStack_250 + fStack_520;
          auVar325._12_4_ = fVar197 * fStack_24c + fStack_51c;
          auVar123 = vsubps_avx(auVar291,auVar208);
          auVar209._0_4_ = auVar123._0_4_ * fVar194 + auVar208._0_4_;
          auVar209._4_4_ = auVar123._4_4_ * fVar195 + auVar208._4_4_;
          auVar209._8_4_ = auVar123._8_4_ * fVar196 + auVar208._8_4_;
          auVar209._12_4_ = auVar123._12_4_ * fVar197 + auVar208._12_4_;
          auVar123 = vsubps_avx(auVar325,auVar291);
          auVar292._0_4_ = auVar291._0_4_ + auVar123._0_4_ * fVar194;
          auVar292._4_4_ = auVar291._4_4_ + auVar123._4_4_ * fVar195;
          auVar292._8_4_ = auVar291._8_4_ + auVar123._8_4_ * fVar196;
          auVar292._12_4_ = auVar291._12_4_ + auVar123._12_4_ * fVar197;
          auVar123 = vsubps_avx(auVar292,auVar209);
          fVar194 = auVar209._0_4_ + auVar123._0_4_ * fVar194;
          fVar195 = auVar209._4_4_ + auVar123._4_4_ * fVar195;
          auVar152._0_8_ = CONCAT44(fVar195,fVar194);
          auVar152._8_4_ = auVar209._8_4_ + auVar123._8_4_ * fVar196;
          auVar152._12_4_ = auVar209._12_4_ + auVar123._12_4_ * fVar197;
          fVar196 = auVar123._0_4_ * 3.0;
          fVar197 = auVar123._4_4_ * 3.0;
          auVar210._0_8_ = CONCAT44(fVar197,fVar196);
          auVar210._8_4_ = auVar123._8_4_ * 3.0;
          auVar210._12_4_ = auVar123._12_4_ * 3.0;
          auVar293._8_8_ = auVar152._0_8_;
          auVar293._0_8_ = auVar152._0_8_;
          auVar123 = vshufpd_avx(auVar152,auVar152,3);
          auVar89 = vshufps_avx(auVar99,auVar99,0x55);
          auVar185 = vsubps_avx(auVar123,auVar293);
          auVar294._0_4_ = auVar89._0_4_ * auVar185._0_4_ + fVar194;
          auVar294._4_4_ = auVar89._4_4_ * auVar185._4_4_ + fVar195;
          auVar294._8_4_ = auVar89._8_4_ * auVar185._8_4_ + fVar194;
          auVar294._12_4_ = auVar89._12_4_ * auVar185._12_4_ + fVar195;
          auVar344._8_8_ = auVar210._0_8_;
          auVar344._0_8_ = auVar210._0_8_;
          auVar123 = vshufpd_avx(auVar210,auVar210,1);
          auVar123 = vsubps_avx(auVar123,auVar344);
          auVar211._0_4_ = fVar196 + auVar89._0_4_ * auVar123._0_4_;
          auVar211._4_4_ = fVar197 + auVar89._4_4_ * auVar123._4_4_;
          auVar211._8_4_ = fVar196 + auVar89._8_4_ * auVar123._8_4_;
          auVar211._12_4_ = fVar197 + auVar89._12_4_ * auVar123._12_4_;
          auVar89 = vmovshdup_avx(auVar211);
          auVar345._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
          auVar345._8_4_ = auVar89._8_4_ ^ 0x80000000;
          auVar345._12_4_ = auVar89._12_4_ ^ 0x80000000;
          auVar176 = vmovshdup_avx(auVar185);
          auVar123 = vunpcklps_avx(auVar176,auVar345);
          auVar186 = vshufps_avx(auVar123,auVar345,4);
          auVar153._0_8_ = auVar185._0_8_ ^ 0x8000000080000000;
          auVar153._8_4_ = -auVar185._8_4_;
          auVar153._12_4_ = -auVar185._12_4_;
          auVar123 = vmovlhps_avx(auVar153,auVar211);
          auVar122 = vshufps_avx(auVar123,auVar211,8);
          auVar123 = ZEXT416((uint)(auVar176._0_4_ * auVar211._0_4_ - auVar89._0_4_ * auVar185._0_4_
                                   ));
          auVar89 = vshufps_avx(auVar123,auVar123,0);
          auVar123 = vdivps_avx(auVar186,auVar89);
          auVar89 = vdivps_avx(auVar122,auVar89);
          auVar122 = vinsertps_avx(auVar233,auVar301,0x1c);
          auVar185 = vinsertps_avx(auVar249,auVar312,0x1c);
          auVar98 = vinsertps_avx(auVar301,auVar233,0x4c);
          auVar149 = vinsertps_avx(auVar312,auVar249,0x4c);
          auVar176 = vmovsldup_avx(auVar123);
          auVar313._0_4_ = auVar176._0_4_ * auVar122._0_4_;
          auVar313._4_4_ = auVar176._4_4_ * auVar122._4_4_;
          auVar313._8_4_ = auVar176._8_4_ * auVar122._8_4_;
          auVar313._12_4_ = auVar176._12_4_ * auVar122._12_4_;
          auVar302._0_4_ = auVar176._0_4_ * auVar185._0_4_;
          auVar302._4_4_ = auVar176._4_4_ * auVar185._4_4_;
          auVar302._8_4_ = auVar176._8_4_ * auVar185._8_4_;
          auVar302._12_4_ = auVar176._12_4_ * auVar185._12_4_;
          auVar186 = vminps_avx(auVar313,auVar302);
          auVar176 = vmaxps_avx(auVar302,auVar313);
          auVar16 = vmovsldup_avx(auVar89);
          auVar368._0_4_ = auVar16._0_4_ * auVar98._0_4_;
          auVar368._4_4_ = auVar16._4_4_ * auVar98._4_4_;
          auVar368._8_4_ = auVar16._8_4_ * auVar98._8_4_;
          auVar368._12_4_ = auVar16._12_4_ * auVar98._12_4_;
          auVar303._0_4_ = auVar16._0_4_ * auVar149._0_4_;
          auVar303._4_4_ = auVar16._4_4_ * auVar149._4_4_;
          auVar303._8_4_ = auVar16._8_4_ * auVar149._8_4_;
          auVar303._12_4_ = auVar16._12_4_ * auVar149._12_4_;
          auVar16 = vminps_avx(auVar368,auVar303);
          auVar125._0_4_ = auVar186._0_4_ + auVar16._0_4_;
          auVar125._4_4_ = auVar186._4_4_ + auVar16._4_4_;
          auVar125._8_4_ = auVar186._8_4_ + auVar16._8_4_;
          auVar125._12_4_ = auVar186._12_4_ + auVar16._12_4_;
          auVar186 = vmaxps_avx(auVar303,auVar368);
          auVar16 = vsubps_avx(auVar265,auVar99);
          auVar80 = vsubps_avx(auVar277,auVar99);
          auVar278._0_4_ = auVar176._0_4_ + auVar186._0_4_;
          auVar278._4_4_ = auVar176._4_4_ + auVar186._4_4_;
          auVar278._8_4_ = auVar176._8_4_ + auVar186._8_4_;
          auVar278._12_4_ = auVar176._12_4_ + auVar186._12_4_;
          auVar314._8_8_ = 0x3f800000;
          auVar314._0_8_ = 0x3f800000;
          auVar176 = vsubps_avx(auVar314,auVar278);
          auVar186 = vsubps_avx(auVar314,auVar125);
          fVar218 = auVar16._0_4_;
          auVar315._0_4_ = fVar218 * auVar176._0_4_;
          fVar330 = auVar16._4_4_;
          auVar315._4_4_ = fVar330 * auVar176._4_4_;
          fVar339 = auVar16._8_4_;
          auVar315._8_4_ = fVar339 * auVar176._8_4_;
          fVar347 = auVar16._12_4_;
          auVar315._12_4_ = fVar347 * auVar176._12_4_;
          fVar196 = auVar80._0_4_;
          auVar279._0_4_ = auVar176._0_4_ * fVar196;
          fVar197 = auVar80._4_4_;
          auVar279._4_4_ = auVar176._4_4_ * fVar197;
          fVar216 = auVar80._8_4_;
          auVar279._8_4_ = auVar176._8_4_ * fVar216;
          fVar217 = auVar80._12_4_;
          auVar279._12_4_ = auVar176._12_4_ * fVar217;
          auVar356._0_4_ = fVar218 * auVar186._0_4_;
          auVar356._4_4_ = fVar330 * auVar186._4_4_;
          auVar356._8_4_ = fVar339 * auVar186._8_4_;
          auVar356._12_4_ = fVar347 * auVar186._12_4_;
          auVar126._0_4_ = fVar196 * auVar186._0_4_;
          auVar126._4_4_ = fVar197 * auVar186._4_4_;
          auVar126._8_4_ = fVar216 * auVar186._8_4_;
          auVar126._12_4_ = fVar217 * auVar186._12_4_;
          auVar176 = vminps_avx(auVar315,auVar356);
          auVar186 = vminps_avx(auVar279,auVar126);
          auVar16 = vminps_avx(auVar176,auVar186);
          auVar176 = vmaxps_avx(auVar356,auVar315);
          auVar186 = vmaxps_avx(auVar126,auVar279);
          auVar80 = vshufps_avx(auVar99,auVar99,0x54);
          auVar186 = vmaxps_avx(auVar186,auVar176);
          auVar81 = vshufps_avx(auVar294,auVar294,0);
          auVar105 = vshufps_avx(auVar294,auVar294,0x55);
          auVar176 = vhaddps_avx(auVar16,auVar16);
          auVar186 = vhaddps_avx(auVar186,auVar186);
          auVar280._0_4_ = auVar81._0_4_ * auVar123._0_4_ + auVar105._0_4_ * auVar89._0_4_;
          auVar280._4_4_ = auVar81._4_4_ * auVar123._4_4_ + auVar105._4_4_ * auVar89._4_4_;
          auVar280._8_4_ = auVar81._8_4_ * auVar123._8_4_ + auVar105._8_4_ * auVar89._8_4_;
          auVar280._12_4_ = auVar81._12_4_ * auVar123._12_4_ + auVar105._12_4_ * auVar89._12_4_;
          auVar16 = vsubps_avx(auVar80,auVar280);
          fVar194 = auVar16._0_4_ + auVar176._0_4_;
          fVar195 = auVar16._0_4_ + auVar186._0_4_;
          auVar176 = vmaxss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar194));
          auVar186 = vminss_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar161));
          if (auVar176._0_4_ <= auVar186._0_4_) {
            auVar176 = vmovshdup_avx(auVar123);
            auVar182._0_4_ = auVar122._0_4_ * auVar176._0_4_;
            auVar182._4_4_ = auVar122._4_4_ * auVar176._4_4_;
            auVar182._8_4_ = auVar122._8_4_ * auVar176._8_4_;
            auVar182._12_4_ = auVar122._12_4_ * auVar176._12_4_;
            auVar127._0_4_ = auVar185._0_4_ * auVar176._0_4_;
            auVar127._4_4_ = auVar185._4_4_ * auVar176._4_4_;
            auVar127._8_4_ = auVar185._8_4_ * auVar176._8_4_;
            auVar127._12_4_ = auVar185._12_4_ * auVar176._12_4_;
            auVar186 = vminps_avx(auVar182,auVar127);
            auVar176 = vmaxps_avx(auVar127,auVar182);
            auVar122 = vmovshdup_avx(auVar89);
            auVar234._0_4_ = auVar122._0_4_ * auVar98._0_4_;
            auVar234._4_4_ = auVar122._4_4_ * auVar98._4_4_;
            auVar234._8_4_ = auVar122._8_4_ * auVar98._8_4_;
            auVar234._12_4_ = auVar122._12_4_ * auVar98._12_4_;
            auVar183._0_4_ = auVar122._0_4_ * auVar149._0_4_;
            auVar183._4_4_ = auVar122._4_4_ * auVar149._4_4_;
            auVar183._8_4_ = auVar122._8_4_ * auVar149._8_4_;
            auVar183._12_4_ = auVar122._12_4_ * auVar149._12_4_;
            auVar122 = vminps_avx(auVar234,auVar183);
            auVar250._0_4_ = auVar186._0_4_ + auVar122._0_4_;
            auVar250._4_4_ = auVar186._4_4_ + auVar122._4_4_;
            auVar250._8_4_ = auVar186._8_4_ + auVar122._8_4_;
            auVar250._12_4_ = auVar186._12_4_ + auVar122._12_4_;
            auVar186 = vmaxps_avx(auVar183,auVar234);
            auVar128._0_4_ = auVar176._0_4_ + auVar186._0_4_;
            auVar128._4_4_ = auVar176._4_4_ + auVar186._4_4_;
            auVar128._8_4_ = auVar176._8_4_ + auVar186._8_4_;
            auVar128._12_4_ = auVar176._12_4_ + auVar186._12_4_;
            auVar176 = vsubps_avx(auVar181,auVar128);
            auVar186 = vsubps_avx(auVar181,auVar250);
            auVar235._0_4_ = fVar218 * auVar176._0_4_;
            auVar235._4_4_ = fVar330 * auVar176._4_4_;
            auVar235._8_4_ = fVar339 * auVar176._8_4_;
            auVar235._12_4_ = fVar347 * auVar176._12_4_;
            auVar251._0_4_ = fVar218 * auVar186._0_4_;
            auVar251._4_4_ = fVar330 * auVar186._4_4_;
            auVar251._8_4_ = fVar339 * auVar186._8_4_;
            auVar251._12_4_ = fVar347 * auVar186._12_4_;
            auVar129._0_4_ = fVar196 * auVar176._0_4_;
            auVar129._4_4_ = fVar197 * auVar176._4_4_;
            auVar129._8_4_ = fVar216 * auVar176._8_4_;
            auVar129._12_4_ = fVar217 * auVar176._12_4_;
            auVar184._0_4_ = fVar196 * auVar186._0_4_;
            auVar184._4_4_ = fVar197 * auVar186._4_4_;
            auVar184._8_4_ = fVar216 * auVar186._8_4_;
            auVar184._12_4_ = fVar217 * auVar186._12_4_;
            auVar176 = vminps_avx(auVar235,auVar251);
            auVar186 = vminps_avx(auVar129,auVar184);
            auVar176 = vminps_avx(auVar176,auVar186);
            auVar186 = vmaxps_avx(auVar251,auVar235);
            auVar122 = vmaxps_avx(auVar184,auVar129);
            auVar176 = vhaddps_avx(auVar176,auVar176);
            auVar186 = vmaxps_avx(auVar122,auVar186);
            auVar186 = vhaddps_avx(auVar186,auVar186);
            auVar122 = vmovshdup_avx(auVar16);
            auVar185 = ZEXT416((uint)(auVar122._0_4_ + auVar176._0_4_));
            auVar176 = vmaxss_avx(local_5b8,auVar185);
            auVar122 = ZEXT416((uint)(auVar122._0_4_ + auVar186._0_4_));
            auVar186 = vminss_avx(auVar122,auVar79);
            auVar357._8_4_ = 0x7fffffff;
            auVar357._0_8_ = 0x7fffffff7fffffff;
            auVar357._12_4_ = 0x7fffffff;
            if (auVar176._0_4_ <= auVar186._0_4_) {
              uVar69 = 0;
              auVar370 = ZEXT864(0) << 0x20;
              if ((fVar163 < fVar194) && (fVar195 < fVar161)) {
                auVar176 = vcmpps_avx(auVar122,auVar79,1);
                auVar186 = vcmpps_avx(local_5b8,auVar185,1);
                auVar176 = vandps_avx(auVar186,auVar176);
                uVar69 = auVar176._0_4_;
              }
              if (((uint)uVar72 < 4 && 0.001 <= fVar162) && (uVar69 & 1) == 0) {
                bVar53 = false;
              }
              else {
                lVar73 = 200;
                do {
                  fVar194 = auVar16._0_4_;
                  fVar162 = 1.0 - fVar194;
                  auVar176 = ZEXT416((uint)(fVar162 * fVar162 * fVar162));
                  auVar176 = vshufps_avx(auVar176,auVar176,0);
                  auVar186 = ZEXT416((uint)(fVar194 * 3.0 * fVar162 * fVar162));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar122 = ZEXT416((uint)(fVar162 * fVar194 * fVar194 * 3.0));
                  auVar122 = vshufps_avx(auVar122,auVar122,0);
                  auVar185 = ZEXT416((uint)(fVar194 * fVar194 * fVar194));
                  auVar185 = vshufps_avx(auVar185,auVar185,0);
                  fVar162 = local_508 * auVar176._0_4_ +
                            (float)local_518._0_4_ * auVar186._0_4_ +
                            (float)local_3b8._0_4_ * auVar185._0_4_ + local_528 * auVar122._0_4_;
                  fVar194 = fStack_504 * auVar176._4_4_ +
                            (float)local_518._4_4_ * auVar186._4_4_ +
                            (float)local_3b8._4_4_ * auVar185._4_4_ + fStack_524 * auVar122._4_4_;
                  auVar130._0_8_ = CONCAT44(fVar194,fVar162);
                  auVar130._8_4_ =
                       fStack_500 * auVar176._8_4_ +
                       fStack_510 * auVar186._8_4_ +
                       fStack_3b0 * auVar185._8_4_ + fStack_520 * auVar122._8_4_;
                  auVar130._12_4_ =
                       fStack_4fc * auVar176._12_4_ +
                       fStack_50c * auVar186._12_4_ +
                       fStack_3ac * auVar185._12_4_ + fStack_51c * auVar122._12_4_;
                  auVar187._8_8_ = auVar130._0_8_;
                  auVar187._0_8_ = auVar130._0_8_;
                  auVar186 = vshufpd_avx(auVar130,auVar130,1);
                  auVar176 = vmovshdup_avx(auVar16);
                  auVar186 = vsubps_avx(auVar186,auVar187);
                  auVar131._0_4_ = auVar176._0_4_ * auVar186._0_4_ + fVar162;
                  auVar131._4_4_ = auVar176._4_4_ * auVar186._4_4_ + fVar194;
                  auVar131._8_4_ = auVar176._8_4_ * auVar186._8_4_ + fVar162;
                  auVar131._12_4_ = auVar176._12_4_ * auVar186._12_4_ + fVar194;
                  auVar176 = vshufps_avx(auVar131,auVar131,0);
                  auVar186 = vshufps_avx(auVar131,auVar131,0x55);
                  auVar188._0_4_ = auVar123._0_4_ * auVar176._0_4_ + auVar89._0_4_ * auVar186._0_4_;
                  auVar188._4_4_ = auVar123._4_4_ * auVar176._4_4_ + auVar89._4_4_ * auVar186._4_4_;
                  auVar188._8_4_ = auVar123._8_4_ * auVar176._8_4_ + auVar89._8_4_ * auVar186._8_4_;
                  auVar188._12_4_ =
                       auVar123._12_4_ * auVar176._12_4_ + auVar89._12_4_ * auVar186._12_4_;
                  auVar16 = vsubps_avx(auVar16,auVar188);
                  auVar176 = vandps_avx(auVar357,auVar131);
                  auVar186 = vshufps_avx(auVar176,auVar176,0xf5);
                  auVar176 = vmaxss_avx(auVar186,auVar176);
                  if (auVar176._0_4_ < fVar160) {
                    fVar162 = auVar16._0_4_;
                    if ((0.0 <= fVar162) && (fVar162 <= 1.0)) {
                      auVar123 = vmovshdup_avx(auVar16);
                      fVar194 = auVar123._0_4_;
                      if ((0.0 <= fVar194) && (fVar194 <= 1.0)) {
                        auVar123 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar149 = vinsertps_avx(auVar123,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar123 = vdpps_avx(auVar149,local_268,0x7f);
                        auVar89 = vdpps_avx(auVar149,local_278,0x7f);
                        auVar176 = vdpps_avx(auVar149,local_2a8,0x7f);
                        auVar186 = vdpps_avx(auVar149,local_2b8,0x7f);
                        auVar122 = vdpps_avx(auVar149,local_2c8,0x7f);
                        auVar185 = vdpps_avx(auVar149,local_2d8,0x7f);
                        fVar217 = 1.0 - fVar194;
                        auVar98 = vdpps_avx(auVar149,local_288,0x7f);
                        auVar149 = vdpps_avx(auVar149,local_298,0x7f);
                        fVar218 = 1.0 - fVar162;
                        fVar195 = auVar16._4_4_;
                        fVar196 = auVar16._8_4_;
                        fVar197 = auVar16._12_4_;
                        fVar216 = fVar218 * fVar162 * fVar162 * 3.0;
                        auVar236._0_4_ = fVar162 * fVar162 * fVar162;
                        auVar236._4_4_ = fVar195 * fVar195 * fVar195;
                        auVar236._8_4_ = fVar196 * fVar196 * fVar196;
                        auVar236._12_4_ = fVar197 * fVar197 * fVar197;
                        fVar195 = fVar162 * 3.0 * fVar218 * fVar218;
                        fVar196 = fVar218 * fVar218 * fVar218;
                        fVar162 = (fVar217 * auVar123._0_4_ + fVar194 * auVar176._0_4_) * fVar196 +
                                  (fVar217 * auVar89._0_4_ + fVar194 * auVar186._0_4_) * fVar195 +
                                  fVar216 * (fVar217 * auVar98._0_4_ + fVar194 * auVar122._0_4_) +
                                  auVar236._0_4_ *
                                  (auVar185._0_4_ * fVar194 + fVar217 * auVar149._0_4_);
                        if ((fVar135 <= fVar162) &&
                           (fVar194 = *(float *)(ray + k * 4 + 0x80), fVar162 <= fVar194)) {
                          pGVar7 = (context->scene->geometries).items[uVar71].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar78 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar78 = true,
                                  pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1a8 = vshufps_avx(auVar16,auVar16,0x55);
                            auVar281._8_4_ = 0x3f800000;
                            auVar281._0_8_ = &DAT_3f8000003f800000;
                            auVar281._12_4_ = 0x3f800000;
                            auVar123 = vsubps_avx(auVar281,local_1a8);
                            fVar197 = local_1a8._0_4_;
                            fVar217 = local_1a8._4_4_;
                            fVar330 = local_1a8._8_4_;
                            fVar339 = local_1a8._12_4_;
                            fVar347 = auVar123._0_4_;
                            fVar348 = auVar123._4_4_;
                            fVar349 = auVar123._8_4_;
                            fVar352 = auVar123._12_4_;
                            auVar295._0_4_ =
                                 fVar197 * (float)local_3f8._0_4_ + fVar347 * (float)local_3c8._0_4_
                            ;
                            auVar295._4_4_ =
                                 fVar217 * (float)local_3f8._4_4_ + fVar348 * (float)local_3c8._4_4_
                            ;
                            auVar295._8_4_ = fVar330 * fStack_3f0 + fVar349 * fStack_3c0;
                            auVar295._12_4_ = fVar339 * fStack_3ec + fVar352 * fStack_3bc;
                            auVar304._0_4_ = fVar197 * fVar237 + fVar347 * fVar219;
                            auVar304._4_4_ = fVar217 * fVar309 + fVar348 * fVar134;
                            auVar304._8_4_ = fVar330 * fVar297 + fVar349 * fVar319;
                            auVar304._12_4_ = fVar339 * fVar320 + fVar352 * fVar308;
                            auVar316._0_4_ = fVar197 * fVar238 + fVar347 * (float)local_3d8._0_4_;
                            auVar316._4_4_ = fVar217 * fVar317 + fVar348 * (float)local_3d8._4_4_;
                            auVar316._8_4_ = fVar330 * fVar306 + fVar349 * fStack_3d0;
                            auVar316._12_4_ = fVar339 * fVar326 + fVar352 * fStack_3cc;
                            auVar282._0_4_ = fVar197 * fVar239 + fVar347 * (float)local_3e8._0_4_;
                            auVar282._4_4_ = fVar217 * fVar318 + fVar348 * (float)local_3e8._4_4_;
                            auVar282._8_4_ = fVar330 * fVar307 + fVar349 * fStack_3e0;
                            auVar282._12_4_ = fVar339 * fVar328 + fVar352 * fStack_3dc;
                            auVar186 = vsubps_avx(auVar304,auVar295);
                            auVar122 = vsubps_avx(auVar316,auVar304);
                            auVar185 = vsubps_avx(auVar282,auVar316);
                            local_1b8 = vshufps_avx(auVar16,auVar16,0);
                            fVar197 = local_1b8._0_4_;
                            fVar330 = local_1b8._4_4_;
                            fVar339 = local_1b8._8_4_;
                            fVar348 = local_1b8._12_4_;
                            auVar123 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                            fVar217 = auVar123._0_4_;
                            fVar218 = auVar123._4_4_;
                            fVar347 = auVar123._8_4_;
                            fVar349 = auVar123._12_4_;
                            auVar123 = vshufps_avx(auVar236,auVar236,0);
                            auVar89 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
                            auVar176 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                            auVar212._0_4_ =
                                 ((auVar122._0_4_ * fVar217 + auVar185._0_4_ * fVar197) * fVar197 +
                                 (auVar186._0_4_ * fVar217 + auVar122._0_4_ * fVar197) * fVar217) *
                                 3.0;
                            auVar212._4_4_ =
                                 ((auVar122._4_4_ * fVar218 + auVar185._4_4_ * fVar330) * fVar330 +
                                 (auVar186._4_4_ * fVar218 + auVar122._4_4_ * fVar330) * fVar218) *
                                 3.0;
                            auVar212._8_4_ =
                                 ((auVar122._8_4_ * fVar347 + auVar185._8_4_ * fVar339) * fVar339 +
                                 (auVar186._8_4_ * fVar347 + auVar122._8_4_ * fVar339) * fVar347) *
                                 3.0;
                            auVar212._12_4_ =
                                 ((auVar122._12_4_ * fVar349 + auVar185._12_4_ * fVar348) * fVar348
                                 + (auVar186._12_4_ * fVar349 + auVar122._12_4_ * fVar348) * fVar349
                                 ) * 3.0;
                            auVar186 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
                            auVar154._0_4_ =
                                 auVar186._0_4_ * (float)local_328._0_4_ +
                                 auVar176._0_4_ * (float)local_338._0_4_ +
                                 auVar123._0_4_ * (float)local_358._0_4_ +
                                 auVar89._0_4_ * (float)local_348._0_4_;
                            auVar154._4_4_ =
                                 auVar186._4_4_ * (float)local_328._4_4_ +
                                 auVar176._4_4_ * (float)local_338._4_4_ +
                                 auVar123._4_4_ * (float)local_358._4_4_ +
                                 auVar89._4_4_ * (float)local_348._4_4_;
                            auVar154._8_4_ =
                                 auVar186._8_4_ * fStack_320 +
                                 auVar176._8_4_ * fStack_330 +
                                 auVar123._8_4_ * fStack_350 + auVar89._8_4_ * fStack_340;
                            auVar154._12_4_ =
                                 auVar186._12_4_ * fStack_31c +
                                 auVar176._12_4_ * fStack_32c +
                                 auVar123._12_4_ * fStack_34c + auVar89._12_4_ * fStack_33c;
                            auVar123 = vshufps_avx(auVar212,auVar212,0xc9);
                            auVar189._0_4_ = auVar154._0_4_ * auVar123._0_4_;
                            auVar189._4_4_ = auVar154._4_4_ * auVar123._4_4_;
                            auVar189._8_4_ = auVar154._8_4_ * auVar123._8_4_;
                            auVar189._12_4_ = auVar154._12_4_ * auVar123._12_4_;
                            auVar123 = vshufps_avx(auVar154,auVar154,0xc9);
                            auVar155._0_4_ = auVar212._0_4_ * auVar123._0_4_;
                            auVar155._4_4_ = auVar212._4_4_ * auVar123._4_4_;
                            auVar155._8_4_ = auVar212._8_4_ * auVar123._8_4_;
                            auVar155._12_4_ = auVar212._12_4_ * auVar123._12_4_;
                            auVar89 = vsubps_avx(auVar155,auVar189);
                            auVar123 = vshufps_avx(auVar89,auVar89,0x55);
                            local_1e8[0] = (RTCHitN)auVar123[0];
                            local_1e8[1] = (RTCHitN)auVar123[1];
                            local_1e8[2] = (RTCHitN)auVar123[2];
                            local_1e8[3] = (RTCHitN)auVar123[3];
                            local_1e8[4] = (RTCHitN)auVar123[4];
                            local_1e8[5] = (RTCHitN)auVar123[5];
                            local_1e8[6] = (RTCHitN)auVar123[6];
                            local_1e8[7] = (RTCHitN)auVar123[7];
                            local_1e8[8] = (RTCHitN)auVar123[8];
                            local_1e8[9] = (RTCHitN)auVar123[9];
                            local_1e8[10] = (RTCHitN)auVar123[10];
                            local_1e8[0xb] = (RTCHitN)auVar123[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar123[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar123[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar123[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar123[0xf];
                            local_1d8 = vshufps_avx(auVar89,auVar89,0xaa);
                            local_1c8 = vshufps_avx(auVar89,auVar89,0);
                            local_198 = local_318._0_8_;
                            uStack_190 = local_318._8_8_;
                            local_188 = local_308._0_8_;
                            uStack_180 = local_308._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar162;
                            local_418 = *local_408;
                            uStack_410 = local_408[1];
                            local_388.valid = (int *)&local_418;
                            local_388.geometryUserPtr = pGVar7->userPtr;
                            local_388.context = context->user;
                            local_388.ray = (RTCRayN *)ray;
                            local_388.hit = local_1e8;
                            local_388.N = 4;
                            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar7->occlusionFilterN)(&local_388);
                            }
                            auVar65._8_8_ = uStack_410;
                            auVar65._0_8_ = local_418;
                            if (auVar65 == (undefined1  [16])0x0) {
                              auVar370 = ZEXT1664(ZEXT816(0));
                              auVar123 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar123 = auVar123 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              auVar370 = ZEXT1664(ZEXT816(0));
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var10)(&local_388);
                                auVar370 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar66._8_8_ = uStack_410;
                              auVar66._0_8_ = local_418;
                              auVar89 = vpcmpeqd_avx(auVar370._0_16_,auVar66);
                              auVar123 = auVar89 ^ _DAT_01febe20;
                              auVar156._8_4_ = 0xff800000;
                              auVar156._0_8_ = 0xff800000ff800000;
                              auVar156._12_4_ = 0xff800000;
                              auVar89 = vblendvps_avx(auVar156,*(undefined1 (*) [16])
                                                                (local_388.ray + 0x80),auVar89);
                              *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar89;
                            }
                            auVar123 = vpslld_avx(auVar123,0x1f);
                            iVar70 = vmovmskps_avx(auVar123);
                            if (iVar70 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar194;
                            }
                            bVar78 = (char)iVar70 != '\0';
                          }
                          bVar67 = (bool)(bVar67 | bVar78);
                        }
                      }
                    }
                    break;
                  }
                  lVar73 = lVar73 + -1;
                } while (lVar73 != 0);
              }
              goto LAB_01060eb7;
            }
          }
          goto LAB_01061263;
        }
      }
LAB_01060eb7:
    } while (bVar53);
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar161),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }